

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm.cpp
# Opt level: O2

int ncnn::lstm(Mat *bottom_blob,Mat *top_blob,int reverse,Mat *weight_xc,Mat *bias_c,Mat *weight_hc,
              Mat *hidden_state,Mat *cell_state,Option *opt)

{
  float *pfVar1;
  float *pfVar2;
  uint uVar3;
  undefined4 uVar4;
  void *pvVar5;
  void *pvVar6;
  void *pvVar7;
  float fVar8;
  float fVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  void *pvVar22;
  uint uVar23;
  uint uVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  uint uVar30;
  long lVar31;
  void *pvVar32;
  void *pvVar33;
  void *pvVar34;
  ulong uVar35;
  ulong uVar36;
  long lVar37;
  void *pvVar38;
  void *pvVar39;
  uint uVar40;
  void *pvVar41;
  void *pvVar42;
  void *pvVar43;
  long lVar44;
  ulong uVar45;
  void *pvVar46;
  ulong uVar47;
  int iVar48;
  int iVar49;
  int iVar50;
  long lVar51;
  long lVar52;
  float *pfVar53;
  long lVar54;
  uint uVar55;
  void *pvVar56;
  void *pvVar57;
  long lVar58;
  long lVar59;
  void *pvVar60;
  long lVar61;
  float *pfVar62;
  void *pvVar63;
  void *pvVar64;
  void *pvVar65;
  void *pvVar66;
  void *pvVar67;
  uint uVar68;
  long lVar69;
  void *pvVar70;
  void *pvVar71;
  void *pvVar72;
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [64];
  float fVar81;
  undefined1 auVar84 [32];
  float fVar95;
  undefined1 auVar85 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  float fVar93;
  float fVar94;
  float fVar96;
  float fVar97;
  float fVar98;
  undefined1 in_ZMM1 [64];
  undefined1 auVar92 [64];
  undefined1 auVar99 [16];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [64];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 in_ZMM3 [64];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  float fVar124;
  undefined1 auVar118 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar123 [64];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  float fVar127;
  float fVar128;
  float fVar129;
  undefined1 in_ZMM5 [64];
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  undefined1 in_ZMM6 [64];
  undefined1 auVar137 [16];
  undefined1 auVar138 [64];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 in_ZMM9 [64];
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  undefined1 in_ZMM10 [64];
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  undefined1 auVar156 [32];
  void *local_298;
  void *local_290;
  void *local_288;
  void *local_280;
  void *local_278;
  void *local_268;
  void *local_260;
  float *gates_data_F_1;
  float *gates_data_I_1;
  float *bias_c_F_1;
  float *bias_c_I_1;
  void *local_220;
  void *local_218;
  void *local_210;
  float *gates_data_G_1;
  float *gates_data_O_1;
  float *bias_c_G_1;
  float *bias_c_O_1;
  int local_1a8;
  float *gates_data_G;
  float *gates_data_O;
  float *gates_data_F;
  float *gates_data_I;
  float *bias_c_G;
  float *bias_c_O;
  float *bias_c_F;
  float *bias_c_I;
  Mat gates;
  undefined1 auVar86 [32];
  undefined1 auVar107 [32];
  undefined1 auVar114 [32];
  undefined1 auVar119 [32];
  undefined1 auVar122 [32];
  
  uVar40 = bottom_blob->w;
  uVar3 = bottom_blob->h;
  uVar55 = top_blob->w;
  Mat::Mat(&gates,uVar55,4,4,opt->workspace_allocator);
  local_1a8 = -100;
  if ((gates.data != (void *)0x0) && ((long)gates.c * gates.cstep != 0)) {
    uVar36 = (ulong)(int)uVar55;
    uVar45 = uVar36 & 0xfffffffffffffffe;
    iVar48 = (int)uVar40 >> 3;
    uVar40 = uVar40 & 7;
    iVar49 = (int)uVar55 >> 3;
    uVar68 = uVar55 & 7;
    lVar51 = (long)(int)(uVar55 * 2);
    lVar31 = (long)(int)(uVar55 * 3);
    local_1a8 = 0;
    uVar55 = 0;
    if (0 < (int)uVar3) {
      uVar55 = uVar3;
    }
    for (uVar30 = 0; pvVar22 = gates.data, uVar30 != uVar55; uVar30 = uVar30 + 1) {
      uVar23 = ~uVar30 + uVar3;
      if (reverse == 0) {
        uVar23 = uVar30;
      }
      lVar25 = (long)(int)uVar23;
      lVar37 = bottom_blob->w * lVar25 * bottom_blob->elemsize;
      pvVar5 = bottom_blob->data;
      pvVar6 = bias_c->data;
      lVar26 = (long)bias_c->w * bias_c->elemsize;
      lVar27 = (long)gates.w * gates.elemsize;
      lVar69 = (long)weight_xc->w * weight_xc->elemsize;
      lVar59 = (long)weight_hc->w * weight_hc->elemsize;
      pvVar63 = weight_xc->data;
      pvVar32 = (void *)(lVar69 * (lVar31 + 1) + (long)pvVar63);
      pvVar33 = (void *)(lVar69 * (lVar51 + 1) + (long)pvVar63);
      pvVar34 = (void *)(lVar69 * (uVar36 + 1) + (long)pvVar63);
      pvVar71 = (void *)(lVar69 * lVar31 + (long)pvVar63);
      pvVar64 = (void *)(lVar69 * lVar51 + (long)pvVar63);
      lVar28 = lVar69 * 2;
      pvVar70 = (void *)(lVar69 * uVar36 + (long)pvVar63);
      pvVar66 = weight_hc->data;
      pvVar57 = (void *)(lVar59 * (lVar31 + 1) + (long)pvVar66);
      pvVar46 = (void *)(lVar59 * (lVar51 + 1) + (long)pvVar66);
      pvVar43 = (void *)(lVar59 * (uVar36 + 1) + (long)pvVar66);
      pvVar41 = (void *)(lVar59 * lVar31 + (long)pvVar66);
      pvVar38 = (void *)(lVar59 * lVar51 + (long)pvVar66);
      lVar29 = lVar59 * 2;
      pvVar60 = (void *)(lVar59 * uVar36 + (long)pvVar66);
      pvVar7 = hidden_state->data;
      lVar54 = 0;
      lVar58 = 0;
      pvVar39 = pvVar32;
      pvVar42 = pvVar34;
      pvVar56 = pvVar63;
      pvVar65 = (void *)((long)pvVar63 + lVar69);
      pvVar67 = pvVar33;
      pvVar72 = pvVar71;
      local_298 = pvVar41;
      local_290 = pvVar46;
      local_288 = pvVar38;
      local_280 = pvVar60;
      local_278 = pvVar66;
      local_268 = pvVar43;
      local_260 = (void *)((long)pvVar66 + lVar59);
      local_220 = pvVar64;
      local_218 = pvVar70;
      local_210 = pvVar57;
      for (uVar35 = 0; uVar47 = uVar35 | 1, (long)uVar47 < (long)uVar36; uVar35 = uVar35 + 2) {
        auVar80 = ZEXT1664(ZEXT816(0) << 0x40);
        lVar61 = 0;
        auVar92 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar102 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar123 = ZEXT1664(ZEXT816(0) << 0x40);
        in_ZMM3 = ZEXT1664(ZEXT816(0) << 0x40);
        in_ZMM5 = ZEXT1664(ZEXT816(0) << 0x40);
        in_ZMM6 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar138 = ZEXT1664(ZEXT816(0) << 0x40);
        lVar44 = lVar54;
        for (iVar50 = iVar48; 0 < iVar50; iVar50 = iVar50 + -1) {
          pfVar62 = (float *)((long)pvVar5 + lVar61 + lVar37);
          fVar98 = *pfVar62;
          fVar81 = pfVar62[1];
          fVar93 = pfVar62[2];
          fVar94 = pfVar62[3];
          fVar95 = pfVar62[4];
          fVar96 = pfVar62[5];
          fVar97 = pfVar62[6];
          pfVar53 = (float *)((long)pvVar56 + lVar61);
          fVar124 = in_ZMM9._28_4_;
          auVar80 = ZEXT3264(CONCAT428(fVar124 + auVar80._28_4_,
                                       CONCAT424(fVar97 * pfVar53[6] + auVar80._24_4_,
                                                 CONCAT420(fVar96 * pfVar53[5] + auVar80._20_4_,
                                                           CONCAT416(fVar95 * pfVar53[4] +
                                                                     auVar80._16_4_,
                                                                     CONCAT412(fVar94 * pfVar53[3] +
                                                                               auVar80._12_4_,
                                                                               CONCAT48(fVar93 * 
                                                  pfVar53[2] + auVar80._8_4_,
                                                  CONCAT44(fVar81 * pfVar53[1] + auVar80._4_4_,
                                                           fVar98 * *pfVar53 + auVar80._0_4_))))))))
          ;
          pfVar53 = (float *)((long)local_218 + lVar61);
          pfVar1 = (float *)((long)local_220 + lVar61);
          auVar92 = ZEXT3264(CONCAT428(fVar124 + auVar92._28_4_,
                                       CONCAT424(fVar97 * pfVar53[6] + auVar92._24_4_,
                                                 CONCAT420(fVar96 * pfVar53[5] + auVar92._20_4_,
                                                           CONCAT416(fVar95 * pfVar53[4] +
                                                                     auVar92._16_4_,
                                                                     CONCAT412(fVar94 * pfVar53[3] +
                                                                               auVar92._12_4_,
                                                                               CONCAT48(fVar93 * 
                                                  pfVar53[2] + auVar92._8_4_,
                                                  CONCAT44(fVar81 * pfVar53[1] + auVar92._4_4_,
                                                           fVar98 * *pfVar53 + auVar92._0_4_))))))))
          ;
          fVar148 = in_ZMM10._28_4_;
          auVar102 = ZEXT3264(CONCAT428(fVar148 + auVar102._28_4_,
                                        CONCAT424(fVar97 * pfVar1[6] + auVar102._24_4_,
                                                  CONCAT420(fVar96 * pfVar1[5] + auVar102._20_4_,
                                                            CONCAT416(fVar95 * pfVar1[4] +
                                                                      auVar102._16_4_,
                                                                      CONCAT412(fVar94 * pfVar1[3] +
                                                                                auVar102._12_4_,
                                                                                CONCAT48(fVar93 * 
                                                  pfVar1[2] + auVar102._8_4_,
                                                  CONCAT44(fVar81 * pfVar1[1] + auVar102._4_4_,
                                                           fVar98 * *pfVar1 + auVar102._0_4_))))))))
          ;
          pfVar53 = (float *)((long)pvVar72 + lVar61);
          auVar123 = ZEXT3264(CONCAT428(fVar124 + auVar123._28_4_,
                                        CONCAT424(fVar97 * pfVar53[6] + auVar123._24_4_,
                                                  CONCAT420(fVar96 * pfVar53[5] + auVar123._20_4_,
                                                            CONCAT416(fVar95 * pfVar53[4] +
                                                                      auVar123._16_4_,
                                                                      CONCAT412(fVar94 * pfVar53[3]
                                                                                + auVar123._12_4_,
                                                                                CONCAT48(fVar93 * 
                                                  pfVar53[2] + auVar123._8_4_,
                                                  CONCAT44(fVar81 * pfVar53[1] + auVar123._4_4_,
                                                           fVar98 * *pfVar53 + auVar123._0_4_)))))))
                             );
          pfVar53 = (float *)((long)pvVar65 + lVar61);
          in_ZMM3 = ZEXT3264(CONCAT428(fVar124 + in_ZMM3._28_4_,
                                       CONCAT424(fVar97 * pfVar53[6] + in_ZMM3._24_4_,
                                                 CONCAT420(fVar96 * pfVar53[5] + in_ZMM3._20_4_,
                                                           CONCAT416(fVar95 * pfVar53[4] +
                                                                     in_ZMM3._16_4_,
                                                                     CONCAT412(fVar94 * pfVar53[3] +
                                                                               in_ZMM3._12_4_,
                                                                               CONCAT48(fVar93 * 
                                                  pfVar53[2] + in_ZMM3._8_4_,
                                                  CONCAT44(fVar81 * pfVar53[1] + in_ZMM3._4_4_,
                                                           fVar98 * *pfVar53 + in_ZMM3._0_4_))))))))
          ;
          pfVar53 = (float *)((long)pvVar42 + lVar61);
          in_ZMM9 = ZEXT3264(CONCAT428(fVar124,CONCAT424(fVar97 * pfVar53[6],
                                                         CONCAT420(fVar96 * pfVar53[5],
                                                                   CONCAT416(fVar95 * pfVar53[4],
                                                                             CONCAT412(fVar94 * 
                                                  pfVar53[3],
                                                  CONCAT48(fVar93 * pfVar53[2],
                                                           CONCAT44(fVar81 * pfVar53[1],
                                                                    fVar98 * *pfVar53))))))));
          pfVar1 = (float *)((long)pvVar67 + lVar61);
          in_ZMM10 = ZEXT3264(CONCAT428(fVar148,CONCAT424(fVar97 * pfVar1[6],
                                                          CONCAT420(fVar96 * pfVar1[5],
                                                                    CONCAT416(fVar95 * pfVar1[4],
                                                                              CONCAT412(fVar94 * 
                                                  pfVar1[3],
                                                  CONCAT48(fVar93 * pfVar1[2],
                                                           CONCAT44(fVar81 * pfVar1[1],
                                                                    fVar98 * *pfVar1))))))));
          in_ZMM5 = ZEXT3264(CONCAT428(fVar124 + in_ZMM5._28_4_,
                                       CONCAT424(fVar97 * pfVar53[6] + in_ZMM5._24_4_,
                                                 CONCAT420(fVar96 * pfVar53[5] + in_ZMM5._20_4_,
                                                           CONCAT416(fVar95 * pfVar53[4] +
                                                                     in_ZMM5._16_4_,
                                                                     CONCAT412(fVar94 * pfVar53[3] +
                                                                               in_ZMM5._12_4_,
                                                                               CONCAT48(fVar93 * 
                                                  pfVar53[2] + in_ZMM5._8_4_,
                                                  CONCAT44(fVar81 * pfVar53[1] + in_ZMM5._4_4_,
                                                           fVar98 * *pfVar53 + in_ZMM5._0_4_))))))))
          ;
          in_ZMM6 = ZEXT3264(CONCAT428(fVar148 + in_ZMM6._28_4_,
                                       CONCAT424(fVar97 * pfVar1[6] + in_ZMM6._24_4_,
                                                 CONCAT420(fVar96 * pfVar1[5] + in_ZMM6._20_4_,
                                                           CONCAT416(fVar95 * pfVar1[4] +
                                                                     in_ZMM6._16_4_,
                                                                     CONCAT412(fVar94 * pfVar1[3] +
                                                                               in_ZMM6._12_4_,
                                                                               CONCAT48(fVar93 * 
                                                  pfVar1[2] + in_ZMM6._8_4_,
                                                  CONCAT44(fVar81 * pfVar1[1] + in_ZMM6._4_4_,
                                                           fVar98 * *pfVar1 + in_ZMM6._0_4_))))))));
          pfVar53 = (float *)((long)pvVar39 + lVar61);
          auVar138 = ZEXT3264(CONCAT428(pfVar62[7] + auVar138._28_4_,
                                        CONCAT424(fVar97 * pfVar53[6] + auVar138._24_4_,
                                                  CONCAT420(fVar96 * pfVar53[5] + auVar138._20_4_,
                                                            CONCAT416(fVar95 * pfVar53[4] +
                                                                      auVar138._16_4_,
                                                                      CONCAT412(fVar94 * pfVar53[3]
                                                                                + auVar138._12_4_,
                                                                                CONCAT48(fVar93 * 
                                                  pfVar53[2] + auVar138._8_4_,
                                                  CONCAT44(fVar81 * pfVar53[1] + auVar138._4_4_,
                                                           fVar98 * *pfVar53 + auVar138._0_4_)))))))
                             );
          lVar61 = lVar61 + 0x20;
          lVar44 = lVar44 + 0x20;
        }
        pfVar62 = (float *)((long)pvVar5 + lVar61 + lVar37);
        lVar52 = 0;
        lVar61 = lVar58;
        iVar50 = iVar49;
        while( true ) {
          if (iVar50 < 1) break;
          pfVar53 = (float *)((long)pvVar7 + lVar52);
          fVar98 = *pfVar53;
          fVar81 = pfVar53[1];
          fVar93 = pfVar53[2];
          fVar94 = pfVar53[3];
          fVar95 = pfVar53[4];
          fVar96 = pfVar53[5];
          fVar97 = pfVar53[6];
          pfVar1 = (float *)((long)local_278 + lVar52);
          fVar124 = in_ZMM9._28_4_;
          auVar80 = ZEXT3264(CONCAT428(fVar124 + auVar80._28_4_,
                                       CONCAT424(fVar97 * pfVar1[6] + auVar80._24_4_,
                                                 CONCAT420(fVar96 * pfVar1[5] + auVar80._20_4_,
                                                           CONCAT416(fVar95 * pfVar1[4] +
                                                                     auVar80._16_4_,
                                                                     CONCAT412(fVar94 * pfVar1[3] +
                                                                               auVar80._12_4_,
                                                                               CONCAT48(fVar93 * 
                                                  pfVar1[2] + auVar80._8_4_,
                                                  CONCAT44(fVar81 * pfVar1[1] + auVar80._4_4_,
                                                           fVar98 * *pfVar1 + auVar80._0_4_))))))));
          pfVar1 = (float *)((long)local_280 + lVar52);
          pfVar2 = (float *)((long)local_288 + lVar52);
          auVar92 = ZEXT3264(CONCAT428(fVar124 + auVar92._28_4_,
                                       CONCAT424(fVar97 * pfVar1[6] + auVar92._24_4_,
                                                 CONCAT420(fVar96 * pfVar1[5] + auVar92._20_4_,
                                                           CONCAT416(fVar95 * pfVar1[4] +
                                                                     auVar92._16_4_,
                                                                     CONCAT412(fVar94 * pfVar1[3] +
                                                                               auVar92._12_4_,
                                                                               CONCAT48(fVar93 * 
                                                  pfVar1[2] + auVar92._8_4_,
                                                  CONCAT44(fVar81 * pfVar1[1] + auVar92._4_4_,
                                                           fVar98 * *pfVar1 + auVar92._0_4_))))))));
          fVar148 = in_ZMM10._28_4_;
          auVar102 = ZEXT3264(CONCAT428(fVar148 + auVar102._28_4_,
                                        CONCAT424(fVar97 * pfVar2[6] + auVar102._24_4_,
                                                  CONCAT420(fVar96 * pfVar2[5] + auVar102._20_4_,
                                                            CONCAT416(fVar95 * pfVar2[4] +
                                                                      auVar102._16_4_,
                                                                      CONCAT412(fVar94 * pfVar2[3] +
                                                                                auVar102._12_4_,
                                                                                CONCAT48(fVar93 * 
                                                  pfVar2[2] + auVar102._8_4_,
                                                  CONCAT44(fVar81 * pfVar2[1] + auVar102._4_4_,
                                                           fVar98 * *pfVar2 + auVar102._0_4_))))))))
          ;
          pfVar1 = (float *)((long)local_298 + lVar52);
          auVar123 = ZEXT3264(CONCAT428(fVar124 + auVar123._28_4_,
                                        CONCAT424(fVar97 * pfVar1[6] + auVar123._24_4_,
                                                  CONCAT420(fVar96 * pfVar1[5] + auVar123._20_4_,
                                                            CONCAT416(fVar95 * pfVar1[4] +
                                                                      auVar123._16_4_,
                                                                      CONCAT412(fVar94 * pfVar1[3] +
                                                                                auVar123._12_4_,
                                                                                CONCAT48(fVar93 * 
                                                  pfVar1[2] + auVar123._8_4_,
                                                  CONCAT44(fVar81 * pfVar1[1] + auVar123._4_4_,
                                                           fVar98 * *pfVar1 + auVar123._0_4_))))))))
          ;
          pfVar1 = (float *)((long)local_260 + lVar52);
          in_ZMM3 = ZEXT3264(CONCAT428(fVar124 + in_ZMM3._28_4_,
                                       CONCAT424(fVar97 * pfVar1[6] + in_ZMM3._24_4_,
                                                 CONCAT420(fVar96 * pfVar1[5] + in_ZMM3._20_4_,
                                                           CONCAT416(fVar95 * pfVar1[4] +
                                                                     in_ZMM3._16_4_,
                                                                     CONCAT412(fVar94 * pfVar1[3] +
                                                                               in_ZMM3._12_4_,
                                                                               CONCAT48(fVar93 * 
                                                  pfVar1[2] + in_ZMM3._8_4_,
                                                  CONCAT44(fVar81 * pfVar1[1] + in_ZMM3._4_4_,
                                                           fVar98 * *pfVar1 + in_ZMM3._0_4_))))))));
          pfVar1 = (float *)((long)local_268 + lVar52);
          in_ZMM9 = ZEXT3264(CONCAT428(fVar124,CONCAT424(fVar97 * pfVar1[6],
                                                         CONCAT420(fVar96 * pfVar1[5],
                                                                   CONCAT416(fVar95 * pfVar1[4],
                                                                             CONCAT412(fVar94 * 
                                                  pfVar1[3],
                                                  CONCAT48(fVar93 * pfVar1[2],
                                                           CONCAT44(fVar81 * pfVar1[1],
                                                                    fVar98 * *pfVar1))))))));
          pfVar2 = (float *)((long)local_290 + lVar52);
          in_ZMM10 = ZEXT3264(CONCAT428(fVar148,CONCAT424(fVar97 * pfVar2[6],
                                                          CONCAT420(fVar96 * pfVar2[5],
                                                                    CONCAT416(fVar95 * pfVar2[4],
                                                                              CONCAT412(fVar94 * 
                                                  pfVar2[3],
                                                  CONCAT48(fVar93 * pfVar2[2],
                                                           CONCAT44(fVar81 * pfVar2[1],
                                                                    fVar98 * *pfVar2))))))));
          in_ZMM5 = ZEXT3264(CONCAT428(fVar124 + in_ZMM5._28_4_,
                                       CONCAT424(fVar97 * pfVar1[6] + in_ZMM5._24_4_,
                                                 CONCAT420(fVar96 * pfVar1[5] + in_ZMM5._20_4_,
                                                           CONCAT416(fVar95 * pfVar1[4] +
                                                                     in_ZMM5._16_4_,
                                                                     CONCAT412(fVar94 * pfVar1[3] +
                                                                               in_ZMM5._12_4_,
                                                                               CONCAT48(fVar93 * 
                                                  pfVar1[2] + in_ZMM5._8_4_,
                                                  CONCAT44(fVar81 * pfVar1[1] + in_ZMM5._4_4_,
                                                           fVar98 * *pfVar1 + in_ZMM5._0_4_))))))));
          in_ZMM6 = ZEXT3264(CONCAT428(fVar148 + in_ZMM6._28_4_,
                                       CONCAT424(fVar97 * pfVar2[6] + in_ZMM6._24_4_,
                                                 CONCAT420(fVar96 * pfVar2[5] + in_ZMM6._20_4_,
                                                           CONCAT416(fVar95 * pfVar2[4] +
                                                                     in_ZMM6._16_4_,
                                                                     CONCAT412(fVar94 * pfVar2[3] +
                                                                               in_ZMM6._12_4_,
                                                                               CONCAT48(fVar93 * 
                                                  pfVar2[2] + in_ZMM6._8_4_,
                                                  CONCAT44(fVar81 * pfVar2[1] + in_ZMM6._4_4_,
                                                           fVar98 * *pfVar2 + in_ZMM6._0_4_))))))));
          pfVar1 = (float *)((long)local_210 + lVar52);
          auVar138 = ZEXT3264(CONCAT428(pfVar53[7] + auVar138._28_4_,
                                        CONCAT424(fVar97 * pfVar1[6] + auVar138._24_4_,
                                                  CONCAT420(fVar96 * pfVar1[5] + auVar138._20_4_,
                                                            CONCAT416(fVar95 * pfVar1[4] +
                                                                      auVar138._16_4_,
                                                                      CONCAT412(fVar94 * pfVar1[3] +
                                                                                auVar138._12_4_,
                                                                                CONCAT48(fVar93 * 
                                                  pfVar1[2] + auVar138._8_4_,
                                                  CONCAT44(fVar81 * pfVar1[1] + auVar138._4_4_,
                                                           fVar98 * *pfVar1 + auVar138._0_4_))))))))
          ;
          iVar50 = iVar50 + -1;
          lVar52 = lVar52 + 0x20;
          lVar61 = lVar61 + 0x20;
        }
        auVar74 = vhaddps_avx(auVar80._0_32_,auVar92._0_32_);
        auVar75 = vhaddps_avx(auVar102._0_32_,auVar123._0_32_);
        auVar75 = vhaddps_avx(auVar74,auVar75);
        auVar74 = vhaddps_avx(in_ZMM3._0_32_,in_ZMM5._0_32_);
        auVar84 = vhaddps_avx(in_ZMM6._0_32_,auVar138._0_32_);
        auVar84 = vhaddps_avx(auVar74,auVar84);
        auVar74 = vblendps_avx(auVar75,auVar84,0xf0);
        auVar75 = vperm2f128_avx(auVar75,auVar84,0x21);
        auVar83 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar6 + uVar47 * 4)),
                                ZEXT416(*(uint *)((long)pvVar6 + uVar47 * 4 + lVar26)),0x10);
        auVar83 = vinsertps_avx(auVar83,ZEXT416(*(uint *)((long)pvVar6 + uVar47 * 4 + lVar26 * 2)),
                                0x20);
        auVar83 = vinsertps_avx(auVar83,ZEXT416(*(uint *)((long)pvVar6 + uVar47 * 4 + lVar26 * 3)),
                                0x30);
        auVar99 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar6 + uVar35 * 4)),
                                ZEXT416(*(uint *)((long)pvVar6 + uVar35 * 4 + lVar26)),0x10);
        auVar99 = vinsertps_avx(auVar99,ZEXT416(*(uint *)((long)pvVar6 + uVar35 * 4 + lVar26 * 2)),
                                0x20);
        auVar99 = vinsertps_avx(auVar99,ZEXT416(*(uint *)((long)pvVar6 + uVar35 * 4 + lVar26 * 3)),
                                0x30);
        auVar84._16_16_ = auVar83;
        auVar84._0_16_ = auVar99;
        auVar73._0_4_ = auVar74._0_4_ + auVar75._0_4_ + auVar99._0_4_;
        auVar73._4_4_ = auVar74._4_4_ + auVar75._4_4_ + auVar99._4_4_;
        auVar73._8_4_ = auVar74._8_4_ + auVar75._8_4_ + auVar99._8_4_;
        auVar73._12_4_ = auVar74._12_4_ + auVar75._12_4_ + auVar99._12_4_;
        auVar73._16_4_ = auVar74._16_4_ + auVar75._16_4_ + auVar83._0_4_;
        auVar73._20_4_ = auVar74._20_4_ + auVar75._20_4_ + auVar83._4_4_;
        auVar73._24_4_ = auVar74._24_4_ + auVar75._24_4_ + auVar83._8_4_;
        auVar73._28_4_ = auVar74._28_4_ + auVar75._28_4_ + auVar83._12_4_;
        pfVar53 = (float *)(lVar52 + (long)pvVar7);
        for (uVar23 = uVar40; uVar24 = uVar68, 0 < (int)uVar23; uVar23 = uVar23 - 1) {
          auVar83 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar63 + lVar69 + lVar44)),
                                  ZEXT416(*(uint *)((long)pvVar34 + lVar44)),0x10);
          auVar83 = vinsertps_avx(auVar83,ZEXT416(*(uint *)((long)pvVar33 + lVar44)),0x20);
          auVar83 = vinsertps_avx(auVar83,ZEXT416(*(uint *)((long)pvVar32 + lVar44)),0x30);
          auVar99 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar63 + lVar44)),
                                  ZEXT416(*(uint *)((long)pvVar70 + lVar44)),0x10);
          auVar99 = vinsertps_avx(auVar99,ZEXT416(*(uint *)((long)pvVar64 + lVar44)),0x20);
          auVar99 = vinsertps_avx(auVar99,ZEXT416(*(uint *)((long)pvVar71 + lVar44)),0x30);
          fVar98 = *pfVar62;
          fVar81 = auVar99._0_4_ * fVar98;
          fVar93 = auVar99._4_4_ * fVar98;
          auVar84._4_4_ = fVar93;
          auVar84._0_4_ = fVar81;
          fVar94 = auVar99._8_4_ * fVar98;
          auVar84._8_4_ = fVar94;
          fVar95 = auVar99._12_4_ * fVar98;
          auVar84._12_4_ = fVar95;
          fVar96 = auVar83._0_4_ * fVar98;
          auVar84._16_4_ = fVar96;
          fVar97 = auVar83._4_4_ * fVar98;
          auVar84._20_4_ = fVar97;
          fVar98 = auVar83._8_4_ * fVar98;
          auVar84._24_4_ = fVar98;
          auVar84._28_4_ = auVar83._12_4_;
          auVar74._0_4_ = fVar81 + auVar73._0_4_;
          auVar74._4_4_ = fVar93 + auVar73._4_4_;
          auVar74._8_4_ = fVar94 + auVar73._8_4_;
          auVar74._12_4_ = fVar95 + auVar73._12_4_;
          auVar74._16_4_ = fVar96 + auVar73._16_4_;
          auVar74._20_4_ = fVar97 + auVar73._20_4_;
          auVar74._24_4_ = fVar98 + auVar73._24_4_;
          auVar74._28_4_ = auVar83._12_4_ + auVar73._28_4_;
          pfVar62 = pfVar62 + 1;
          lVar44 = lVar44 + 4;
          auVar73 = auVar74;
        }
        while( true ) {
          in_ZMM1 = ZEXT3264(auVar84);
          if ((int)uVar24 < 1) break;
          auVar83 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar66 + lVar59 + lVar61)),
                                  ZEXT416(*(uint *)((long)pvVar43 + lVar61)),0x10);
          auVar83 = vinsertps_avx(auVar83,ZEXT416(*(uint *)((long)pvVar46 + lVar61)),0x20);
          auVar83 = vinsertps_avx(auVar83,ZEXT416(*(uint *)((long)pvVar57 + lVar61)),0x30);
          auVar99 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar66 + lVar61)),
                                  ZEXT416(*(uint *)((long)pvVar60 + lVar61)),0x10);
          auVar99 = vinsertps_avx(auVar99,ZEXT416(*(uint *)((long)pvVar38 + lVar61)),0x20);
          auVar99 = vinsertps_avx(auVar99,ZEXT416(*(uint *)((long)pvVar41 + lVar61)),0x30);
          fVar98 = *pfVar53;
          fVar81 = auVar99._0_4_ * fVar98;
          fVar93 = auVar99._4_4_ * fVar98;
          auVar84._4_4_ = fVar93;
          auVar84._0_4_ = fVar81;
          fVar94 = auVar99._8_4_ * fVar98;
          auVar84._8_4_ = fVar94;
          fVar95 = auVar99._12_4_ * fVar98;
          auVar84._12_4_ = fVar95;
          fVar96 = auVar83._0_4_ * fVar98;
          auVar84._16_4_ = fVar96;
          fVar97 = auVar83._4_4_ * fVar98;
          auVar84._20_4_ = fVar97;
          fVar98 = auVar83._8_4_ * fVar98;
          auVar84._24_4_ = fVar98;
          auVar84._28_4_ = auVar83._12_4_;
          auVar75._0_4_ = fVar81 + auVar73._0_4_;
          auVar75._4_4_ = fVar93 + auVar73._4_4_;
          auVar75._8_4_ = fVar94 + auVar73._8_4_;
          auVar75._12_4_ = fVar95 + auVar73._12_4_;
          auVar75._16_4_ = fVar96 + auVar73._16_4_;
          auVar75._20_4_ = fVar97 + auVar73._20_4_;
          auVar75._24_4_ = fVar98 + auVar73._24_4_;
          auVar75._28_4_ = auVar83._12_4_ + auVar73._28_4_;
          pfVar53 = pfVar53 + 1;
          lVar61 = lVar61 + 4;
          auVar73 = auVar75;
          uVar24 = uVar24 - 1;
        }
        *(float *)((long)gates.data + uVar35 * 4) = auVar73._0_4_;
        auVar83 = auVar73._0_16_;
        uVar4 = vextractps_avx(auVar83,1);
        *(undefined4 *)((long)gates.data + uVar35 * 4 + lVar27) = uVar4;
        uVar4 = vextractps_avx(auVar83,2);
        *(undefined4 *)((long)gates.data + uVar35 * 4 + lVar27 * 2) = uVar4;
        uVar4 = vextractps_avx(auVar83,3);
        *(undefined4 *)((long)gates.data + uVar35 * 4 + lVar27 * 3) = uVar4;
        auVar83 = auVar73._16_16_;
        *(float *)((long)gates.data + uVar47 * 4) = auVar73._16_4_;
        uVar4 = vextractps_avx(auVar83,1);
        *(undefined4 *)((long)gates.data + uVar47 * 4 + lVar27) = uVar4;
        uVar4 = vextractps_avx(auVar83,2);
        *(undefined4 *)((long)gates.data + uVar47 * 4 + lVar27 * 2) = uVar4;
        uVar4 = vextractps_avx(auVar83,3);
        *(undefined4 *)((long)gates.data + uVar47 * 4 + lVar27 * 3) = uVar4;
        pvVar39 = (void *)((long)pvVar39 + lVar28);
        pvVar67 = (void *)((long)pvVar67 + lVar28);
        pvVar42 = (void *)((long)pvVar42 + lVar28);
        pvVar65 = (void *)((long)pvVar65 + lVar28);
        pvVar72 = (void *)((long)pvVar72 + lVar28);
        local_220 = (void *)((long)local_220 + lVar28);
        local_218 = (void *)((long)local_218 + lVar28);
        pvVar56 = (void *)((long)pvVar56 + lVar28);
        local_210 = (void *)((long)local_210 + lVar29);
        local_290 = (void *)((long)local_290 + lVar29);
        local_268 = (void *)((long)local_268 + lVar29);
        local_260 = (void *)((long)local_260 + lVar29);
        local_298 = (void *)((long)local_298 + lVar29);
        local_288 = (void *)((long)local_288 + lVar29);
        local_280 = (void *)((long)local_280 + lVar29);
        local_278 = (void *)((long)local_278 + lVar29);
        lVar54 = lVar54 + lVar28;
        lVar58 = lVar58 + lVar29;
      }
      lVar27 = bottom_blob->w * lVar25 * bottom_blob->elemsize;
      pvVar5 = bottom_blob->data;
      pvVar6 = bias_c->data;
      lVar28 = (long)bias_c->w * bias_c->elemsize;
      pvVar63 = weight_xc->data;
      pvVar66 = weight_hc->data;
      lVar37 = (long)weight_xc->w * weight_xc->elemsize;
      pvVar41 = (void *)(lVar37 * uVar45 + (long)pvVar63);
      pvVar43 = (void *)(lVar37 * (uVar36 + uVar45) + (long)pvVar63);
      pvVar46 = (void *)(lVar37 * (lVar51 + uVar45) + (long)pvVar63);
      lVar58 = (long)weight_hc->w * weight_hc->elemsize;
      pvVar63 = (void *)(lVar37 * (lVar31 + uVar45) + (long)pvVar63);
      pvVar34 = (void *)(lVar58 * uVar45 + (long)pvVar66);
      pvVar38 = (void *)(lVar58 * (uVar36 + uVar45) + (long)pvVar66);
      pvVar57 = (void *)(lVar58 * (lVar51 + uVar45) + (long)pvVar66);
      pvVar66 = (void *)(lVar58 * (lVar31 + uVar45) + (long)pvVar66);
      lVar29 = (long)gates.w * gates.elemsize;
      pvVar7 = hidden_state->data;
      lVar26 = 0;
      lVar54 = 0;
      pvVar39 = pvVar34;
      pvVar42 = pvVar41;
      pvVar56 = pvVar43;
      pvVar65 = pvVar46;
      pvVar67 = pvVar63;
      pvVar72 = pvVar66;
      pvVar32 = pvVar38;
      pvVar33 = pvVar57;
      for (uVar35 = uVar45; (long)uVar35 < (long)uVar36; uVar35 = uVar35 + 1) {
        auVar80 = ZEXT1664(ZEXT816(0) << 0x40);
        lVar69 = 0;
        auVar92 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar102 = ZEXT1664(ZEXT816(0) << 0x40);
        in_ZMM3 = ZEXT1664(ZEXT816(0) << 0x40);
        lVar59 = lVar26;
        for (iVar50 = iVar48; 0 < iVar50; iVar50 = iVar50 + -1) {
          pfVar62 = (float *)((long)pvVar5 + lVar69 + lVar27);
          fVar98 = *pfVar62;
          fVar81 = pfVar62[1];
          fVar93 = pfVar62[2];
          fVar94 = pfVar62[3];
          fVar95 = pfVar62[4];
          fVar96 = pfVar62[5];
          fVar97 = pfVar62[6];
          pfVar53 = (float *)((long)pvVar42 + lVar69);
          fVar124 = in_ZMM5._28_4_;
          auVar80 = ZEXT3264(CONCAT428(fVar124 + auVar80._28_4_,
                                       CONCAT424(fVar97 * pfVar53[6] + auVar80._24_4_,
                                                 CONCAT420(fVar96 * pfVar53[5] + auVar80._20_4_,
                                                           CONCAT416(fVar95 * pfVar53[4] +
                                                                     auVar80._16_4_,
                                                                     CONCAT412(fVar94 * pfVar53[3] +
                                                                               auVar80._12_4_,
                                                                               CONCAT48(fVar93 * 
                                                  pfVar53[2] + auVar80._8_4_,
                                                  CONCAT44(fVar81 * pfVar53[1] + auVar80._4_4_,
                                                           fVar98 * *pfVar53 + auVar80._0_4_))))))))
          ;
          pfVar53 = (float *)((long)pvVar56 + lVar69);
          in_ZMM5 = ZEXT3264(CONCAT428(fVar124,CONCAT424(fVar97 * pfVar53[6],
                                                         CONCAT420(fVar96 * pfVar53[5],
                                                                   CONCAT416(fVar95 * pfVar53[4],
                                                                             CONCAT412(fVar94 * 
                                                  pfVar53[3],
                                                  CONCAT48(fVar93 * pfVar53[2],
                                                           CONCAT44(fVar81 * pfVar53[1],
                                                                    fVar98 * *pfVar53))))))));
          pfVar1 = (float *)((long)pvVar65 + lVar69);
          auVar123._0_4_ = fVar98 * *pfVar1;
          auVar123._4_4_ = fVar81 * pfVar1[1];
          auVar123._8_4_ = fVar93 * pfVar1[2];
          auVar123._12_4_ = fVar94 * pfVar1[3];
          auVar123._16_4_ = fVar95 * pfVar1[4];
          auVar123._20_4_ = fVar96 * pfVar1[5];
          auVar123._28_36_ = in_ZMM6._28_36_;
          auVar123._24_4_ = fVar97 * pfVar1[6];
          auVar92 = ZEXT3264(CONCAT428(fVar124 + auVar92._28_4_,
                                       CONCAT424(fVar97 * pfVar53[6] + auVar92._24_4_,
                                                 CONCAT420(fVar96 * pfVar53[5] + auVar92._20_4_,
                                                           CONCAT416(fVar95 * pfVar53[4] +
                                                                     auVar92._16_4_,
                                                                     CONCAT412(fVar94 * pfVar53[3] +
                                                                               auVar92._12_4_,
                                                                               CONCAT48(fVar93 * 
                                                  pfVar53[2] + auVar92._8_4_,
                                                  CONCAT44(fVar81 * pfVar53[1] + auVar92._4_4_,
                                                           fVar98 * *pfVar53 + auVar92._0_4_))))))))
          ;
          auVar102 = ZEXT3264(CONCAT428(in_ZMM6._28_4_ + auVar102._28_4_,
                                        CONCAT424(auVar123._24_4_ + auVar102._24_4_,
                                                  CONCAT420(auVar123._20_4_ + auVar102._20_4_,
                                                            CONCAT416(auVar123._16_4_ +
                                                                      auVar102._16_4_,
                                                                      CONCAT412(auVar123._12_4_ +
                                                                                auVar102._12_4_,
                                                                                CONCAT48(auVar123.
                                                  _8_4_ + auVar102._8_4_,
                                                  CONCAT44(auVar123._4_4_ + auVar102._4_4_,
                                                           auVar123._0_4_ + auVar102._0_4_))))))));
          pfVar53 = (float *)((long)pvVar67 + lVar69);
          in_ZMM3 = ZEXT3264(CONCAT428(pfVar62[7] + in_ZMM3._28_4_,
                                       CONCAT424(fVar97 * pfVar53[6] + in_ZMM3._24_4_,
                                                 CONCAT420(fVar96 * pfVar53[5] + in_ZMM3._20_4_,
                                                           CONCAT416(fVar95 * pfVar53[4] +
                                                                     in_ZMM3._16_4_,
                                                                     CONCAT412(fVar94 * pfVar53[3] +
                                                                               in_ZMM3._12_4_,
                                                                               CONCAT48(fVar93 * 
                                                  pfVar53[2] + in_ZMM3._8_4_,
                                                  CONCAT44(fVar81 * pfVar53[1] + in_ZMM3._4_4_,
                                                           fVar98 * *pfVar53 + in_ZMM3._0_4_))))))))
          ;
          lVar69 = lVar69 + 0x20;
          lVar59 = lVar59 + 0x20;
          in_ZMM6 = ZEXT3264(auVar123._0_32_);
        }
        pfVar62 = (float *)((long)pvVar5 + lVar69 + lVar27);
        lVar44 = 0;
        lVar69 = lVar54;
        iVar50 = iVar49;
        while( true ) {
          if (iVar50 < 1) break;
          pfVar2 = (float *)((long)pvVar7 + lVar44);
          fVar98 = *pfVar2;
          fVar81 = pfVar2[1];
          fVar93 = pfVar2[2];
          fVar94 = pfVar2[3];
          fVar95 = pfVar2[4];
          fVar96 = pfVar2[5];
          fVar97 = pfVar2[6];
          pfVar53 = (float *)((long)pvVar39 + lVar44);
          fVar124 = in_ZMM5._28_4_;
          auVar80 = ZEXT3264(CONCAT428(fVar124 + auVar80._28_4_,
                                       CONCAT424(fVar97 * pfVar53[6] + auVar80._24_4_,
                                                 CONCAT420(fVar96 * pfVar53[5] + auVar80._20_4_,
                                                           CONCAT416(fVar95 * pfVar53[4] +
                                                                     auVar80._16_4_,
                                                                     CONCAT412(fVar94 * pfVar53[3] +
                                                                               auVar80._12_4_,
                                                                               CONCAT48(fVar93 * 
                                                  pfVar53[2] + auVar80._8_4_,
                                                  CONCAT44(fVar81 * pfVar53[1] + auVar80._4_4_,
                                                           fVar98 * *pfVar53 + auVar80._0_4_))))))))
          ;
          pfVar53 = (float *)((long)pvVar32 + lVar44);
          in_ZMM5 = ZEXT3264(CONCAT428(fVar124,CONCAT424(fVar97 * pfVar53[6],
                                                         CONCAT420(fVar96 * pfVar53[5],
                                                                   CONCAT416(fVar95 * pfVar53[4],
                                                                             CONCAT412(fVar94 * 
                                                  pfVar53[3],
                                                  CONCAT48(fVar93 * pfVar53[2],
                                                           CONCAT44(fVar81 * pfVar53[1],
                                                                    fVar98 * *pfVar53))))))));
          pfVar1 = (float *)((long)pvVar33 + lVar44);
          auVar138._0_4_ = fVar98 * *pfVar1;
          auVar138._4_4_ = fVar81 * pfVar1[1];
          auVar138._8_4_ = fVar93 * pfVar1[2];
          auVar138._12_4_ = fVar94 * pfVar1[3];
          auVar138._16_4_ = fVar95 * pfVar1[4];
          auVar138._20_4_ = fVar96 * pfVar1[5];
          auVar138._28_36_ = in_ZMM6._28_36_;
          auVar138._24_4_ = fVar97 * pfVar1[6];
          auVar92 = ZEXT3264(CONCAT428(fVar124 + auVar92._28_4_,
                                       CONCAT424(fVar97 * pfVar53[6] + auVar92._24_4_,
                                                 CONCAT420(fVar96 * pfVar53[5] + auVar92._20_4_,
                                                           CONCAT416(fVar95 * pfVar53[4] +
                                                                     auVar92._16_4_,
                                                                     CONCAT412(fVar94 * pfVar53[3] +
                                                                               auVar92._12_4_,
                                                                               CONCAT48(fVar93 * 
                                                  pfVar53[2] + auVar92._8_4_,
                                                  CONCAT44(fVar81 * pfVar53[1] + auVar92._4_4_,
                                                           fVar98 * *pfVar53 + auVar92._0_4_))))))))
          ;
          auVar102 = ZEXT3264(CONCAT428(in_ZMM6._28_4_ + auVar102._28_4_,
                                        CONCAT424(auVar138._24_4_ + auVar102._24_4_,
                                                  CONCAT420(auVar138._20_4_ + auVar102._20_4_,
                                                            CONCAT416(auVar138._16_4_ +
                                                                      auVar102._16_4_,
                                                                      CONCAT412(auVar138._12_4_ +
                                                                                auVar102._12_4_,
                                                                                CONCAT48(auVar138.
                                                  _8_4_ + auVar102._8_4_,
                                                  CONCAT44(auVar138._4_4_ + auVar102._4_4_,
                                                           auVar138._0_4_ + auVar102._0_4_))))))));
          pfVar53 = (float *)((long)pvVar72 + lVar44);
          in_ZMM3 = ZEXT3264(CONCAT428(pfVar2[7] + in_ZMM3._28_4_,
                                       CONCAT424(fVar97 * pfVar53[6] + in_ZMM3._24_4_,
                                                 CONCAT420(fVar96 * pfVar53[5] + in_ZMM3._20_4_,
                                                           CONCAT416(fVar95 * pfVar53[4] +
                                                                     in_ZMM3._16_4_,
                                                                     CONCAT412(fVar94 * pfVar53[3] +
                                                                               in_ZMM3._12_4_,
                                                                               CONCAT48(fVar93 * 
                                                  pfVar53[2] + in_ZMM3._8_4_,
                                                  CONCAT44(fVar81 * pfVar53[1] + in_ZMM3._4_4_,
                                                           fVar98 * *pfVar53 + in_ZMM3._0_4_))))))))
          ;
          iVar50 = iVar50 + -1;
          lVar44 = lVar44 + 0x20;
          lVar69 = lVar69 + 0x20;
          in_ZMM6 = ZEXT3264(auVar138._0_32_);
        }
        auVar74 = vhaddps_avx(auVar80._0_32_,auVar92._0_32_);
        auVar75 = vhaddps_avx(auVar102._0_32_,in_ZMM3._0_32_);
        auVar74 = vhaddps_avx(auVar74,auVar75);
        auVar99 = auVar74._16_16_;
        auVar83 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar6 + uVar35 * 4)),
                                ZEXT416(*(uint *)((long)pvVar6 + uVar35 * 4 + lVar28)),0x10);
        auVar83 = vinsertps_avx(auVar83,ZEXT416(*(uint *)((long)pvVar6 + uVar35 * 4 + lVar28 * 2)),
                                0x20);
        auVar83 = vinsertps_avx(auVar83,ZEXT416(*(uint *)((long)pvVar6 + uVar35 * 4 + lVar28 * 3)),
                                0x30);
        auVar105._0_4_ = auVar83._0_4_ + auVar74._0_4_ + auVar74._16_4_;
        auVar105._4_4_ = auVar83._4_4_ + auVar74._4_4_ + auVar74._20_4_;
        auVar105._8_4_ = auVar83._8_4_ + auVar74._8_4_ + auVar74._24_4_;
        auVar105._12_4_ = auVar83._12_4_ + auVar74._12_4_ + auVar74._28_4_;
        pfVar53 = (float *)(lVar44 + (long)pvVar7);
        for (uVar23 = uVar40; uVar24 = uVar68, 0 < (int)uVar23; uVar23 = uVar23 - 1) {
          auVar83 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar41 + lVar59)),
                                  ZEXT416(*(uint *)((long)pvVar43 + lVar59)),0x10);
          auVar83 = vinsertps_avx(auVar83,ZEXT416(*(uint *)((long)pvVar46 + lVar59)),0x20);
          auVar83 = vinsertps_avx(auVar83,ZEXT416(*(uint *)((long)pvVar63 + lVar59)),0x30);
          fVar98 = *pfVar62;
          auVar99._0_4_ = auVar83._0_4_ * fVar98;
          auVar99._4_4_ = auVar83._4_4_ * fVar98;
          auVar99._8_4_ = auVar83._8_4_ * fVar98;
          auVar99._12_4_ = auVar83._12_4_ * fVar98;
          auVar83._0_4_ = auVar99._0_4_ + auVar105._0_4_;
          auVar83._4_4_ = auVar99._4_4_ + auVar105._4_4_;
          auVar83._8_4_ = auVar99._8_4_ + auVar105._8_4_;
          auVar83._12_4_ = auVar99._12_4_ + auVar105._12_4_;
          pfVar62 = pfVar62 + 1;
          lVar59 = lVar59 + 4;
          auVar105 = auVar83;
        }
        while( true ) {
          in_ZMM1 = ZEXT1664(auVar99);
          if ((int)uVar24 < 1) break;
          auVar83 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar34 + lVar69)),
                                  ZEXT416(*(uint *)((long)pvVar38 + lVar69)),0x10);
          auVar83 = vinsertps_avx(auVar83,ZEXT416(*(uint *)((long)pvVar57 + lVar69)),0x20);
          auVar83 = vinsertps_avx(auVar83,ZEXT416(*(uint *)((long)pvVar66 + lVar69)),0x30);
          fVar98 = *pfVar53;
          auVar99._0_4_ = auVar83._0_4_ * fVar98;
          auVar99._4_4_ = auVar83._4_4_ * fVar98;
          auVar99._8_4_ = auVar83._8_4_ * fVar98;
          auVar99._12_4_ = auVar83._12_4_ * fVar98;
          auVar117._0_4_ = auVar99._0_4_ + auVar105._0_4_;
          auVar117._4_4_ = auVar99._4_4_ + auVar105._4_4_;
          auVar117._8_4_ = auVar99._8_4_ + auVar105._8_4_;
          auVar117._12_4_ = auVar99._12_4_ + auVar105._12_4_;
          pfVar53 = pfVar53 + 1;
          lVar69 = lVar69 + 4;
          auVar105 = auVar117;
          uVar24 = uVar24 - 1;
        }
        *(float *)((long)gates.data + uVar35 * 4) = auVar105._0_4_;
        uVar4 = vextractps_avx(auVar105,1);
        *(undefined4 *)((long)gates.data + uVar35 * 4 + lVar29) = uVar4;
        uVar4 = vextractps_avx(auVar105,2);
        *(undefined4 *)((long)gates.data + uVar35 * 4 + lVar29 * 2) = uVar4;
        uVar4 = vextractps_avx(auVar105,3);
        *(undefined4 *)((long)gates.data + uVar35 * 4 + lVar29 * 3) = uVar4;
        pvVar42 = (void *)((long)pvVar42 + lVar37);
        pvVar56 = (void *)((long)pvVar56 + lVar37);
        pvVar65 = (void *)((long)pvVar65 + lVar37);
        pvVar67 = (void *)((long)pvVar67 + lVar37);
        pvVar39 = (void *)((long)pvVar39 + lVar58);
        pvVar32 = (void *)((long)pvVar32 + lVar58);
        pvVar33 = (void *)((long)pvVar33 + lVar58);
        pvVar72 = (void *)((long)pvVar72 + lVar58);
        lVar26 = lVar26 + lVar37;
        lVar54 = lVar54 + lVar58;
      }
      lVar29 = top_blob->w * lVar25 * top_blob->elemsize;
      pvVar5 = top_blob->data;
      pvVar6 = cell_state->data;
      pvVar63 = hidden_state->data;
      lVar28 = (long)gates.w * gates.elemsize;
      lVar25 = 0;
      for (iVar50 = iVar49; uVar23 = uVar68, 0 < iVar50; iVar50 = iVar50 + -1) {
        auVar74 = *(undefined1 (*) [32])((long)gates.data + lVar25);
        auVar76._0_8_ = auVar74._0_8_ ^ 0x8000000080000000;
        auVar76._8_4_ = auVar74._8_4_ ^ 0x80000000;
        auVar76._12_4_ = auVar74._12_4_ ^ 0x80000000;
        auVar76._16_4_ = auVar74._16_4_ ^ 0x80000000;
        auVar76._20_4_ = auVar74._20_4_ ^ 0x80000000;
        auVar76._24_4_ = auVar74._24_4_ ^ 0x80000000;
        auVar76._28_4_ = auVar74._28_4_ ^ 0x80000000;
        auVar139._8_4_ = 0x42b0c0a5;
        auVar139._0_8_ = 0x42b0c0a542b0c0a5;
        auVar139._12_4_ = 0x42b0c0a5;
        auVar139._16_4_ = 0x42b0c0a5;
        auVar139._20_4_ = 0x42b0c0a5;
        auVar139._24_4_ = 0x42b0c0a5;
        auVar139._28_4_ = 0x42b0c0a5;
        auVar74 = vminps_avx(auVar139,auVar76);
        auVar140._8_4_ = 0xc2b0c0a5;
        auVar140._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar140._12_4_ = 0xc2b0c0a5;
        auVar140._16_4_ = 0xc2b0c0a5;
        auVar140._20_4_ = 0xc2b0c0a5;
        auVar140._24_4_ = 0xc2b0c0a5;
        auVar140._28_4_ = 0xc2b0c0a5;
        auVar75 = vmaxps_avx(auVar140,auVar74);
        auVar85._0_4_ = auVar75._0_4_ * 1.442695 + 0.5;
        auVar85._4_4_ = auVar75._4_4_ * 1.442695 + 0.5;
        auVar85._8_4_ = auVar75._8_4_ * 1.442695 + 0.5;
        auVar85._12_4_ = auVar75._12_4_ * 1.442695 + 0.5;
        auVar85._16_4_ = auVar75._16_4_ * 1.442695 + 0.5;
        auVar85._20_4_ = auVar75._20_4_ * 1.442695 + 0.5;
        auVar85._24_4_ = auVar75._24_4_ * 1.442695 + 0.5;
        auVar85._28_4_ = in_ZMM1._28_4_ + 0.5;
        auVar84 = vroundps_avx(auVar85,1);
        auVar74 = vcmpps_avx(auVar85,auVar84,1);
        auVar156._8_4_ = 0x3f800000;
        auVar156._0_8_ = 0x3f8000003f800000;
        auVar156._12_4_ = 0x3f800000;
        auVar156._16_4_ = 0x3f800000;
        auVar156._20_4_ = 0x3f800000;
        auVar156._24_4_ = 0x3f800000;
        auVar156._28_4_ = 0x3f800000;
        auVar74 = vandps_avx(auVar156,auVar74);
        auVar74 = vsubps_avx(auVar84,auVar74);
        auVar10._4_4_ = auVar74._4_4_ * 0.6931472;
        auVar10._0_4_ = auVar74._0_4_ * 0.6931472;
        auVar10._8_4_ = auVar74._8_4_ * 0.6931472;
        auVar10._12_4_ = auVar74._12_4_ * 0.6931472;
        auVar10._16_4_ = auVar74._16_4_ * 0.6931472;
        auVar10._20_4_ = auVar74._20_4_ * 0.6931472;
        auVar10._24_4_ = auVar74._24_4_ * 0.6931472;
        auVar10._28_4_ = auVar84._28_4_;
        auVar75 = vsubps_avx(auVar75,auVar10);
        fVar98 = auVar75._0_4_;
        fVar81 = auVar75._4_4_;
        fVar93 = auVar75._8_4_;
        fVar94 = auVar75._12_4_;
        fVar95 = auVar75._16_4_;
        fVar96 = auVar75._20_4_;
        fVar97 = auVar75._24_4_;
        auVar82._0_4_ = (int)auVar74._0_4_;
        auVar82._4_4_ = (int)auVar74._4_4_;
        auVar82._8_4_ = (int)auVar74._8_4_;
        auVar82._12_4_ = (int)auVar74._12_4_;
        auVar86._16_4_ = (int)auVar74._16_4_;
        auVar86._0_16_ = auVar82;
        auVar86._20_4_ = (int)auVar74._20_4_;
        auVar86._24_4_ = (int)auVar74._24_4_;
        auVar86._28_4_ = (int)auVar74._28_4_;
        auVar99 = vpslld_avx(auVar82,0x17);
        auVar83 = vpslld_avx(auVar86._16_16_,0x17);
        auVar137._8_4_ = 0x3f800000;
        auVar137._0_8_ = 0x3f8000003f800000;
        auVar137._12_4_ = 0x3f800000;
        auVar83 = vpaddd_avx(auVar83,auVar137);
        auVar99 = vpaddd_avx(auVar99,auVar137);
        auVar100._0_4_ =
             (fVar98 + 1.0 +
             fVar98 * fVar98 *
             (((((fVar98 * 0.00019875691 + 0.0013981999) * fVar98 + 0.008333452) * fVar98 +
               0.041665796) * fVar98 + 0.16666666) * fVar98 + 0.5)) * auVar99._0_4_ + 1.0;
        auVar100._4_4_ =
             (fVar81 + 1.0 +
             fVar81 * fVar81 *
             (((((fVar81 * 0.00019875691 + 0.0013981999) * fVar81 + 0.008333452) * fVar81 +
               0.041665796) * fVar81 + 0.16666666) * fVar81 + 0.5)) * auVar99._4_4_ + 1.0;
        auVar100._8_4_ =
             (fVar93 + 1.0 +
             fVar93 * fVar93 *
             (((((fVar93 * 0.00019875691 + 0.0013981999) * fVar93 + 0.008333452) * fVar93 +
               0.041665796) * fVar93 + 0.16666666) * fVar93 + 0.5)) * auVar99._8_4_ + 1.0;
        auVar100._12_4_ =
             (fVar94 + 1.0 +
             fVar94 * fVar94 *
             (((((fVar94 * 0.00019875691 + 0.0013981999) * fVar94 + 0.008333452) * fVar94 +
               0.041665796) * fVar94 + 0.16666666) * fVar94 + 0.5)) * auVar99._12_4_ + 1.0;
        auVar100._16_4_ =
             (fVar95 + 1.0 +
             fVar95 * fVar95 *
             (((((fVar95 * 0.00019875691 + 0.0013981999) * fVar95 + 0.008333452) * fVar95 +
               0.041665796) * fVar95 + 0.16666666) * fVar95 + 0.5)) * auVar83._0_4_ + 1.0;
        auVar100._20_4_ =
             (fVar96 + 1.0 +
             fVar96 * fVar96 *
             (((((fVar96 * 0.00019875691 + 0.0013981999) * fVar96 + 0.008333452) * fVar96 +
               0.041665796) * fVar96 + 0.16666666) * fVar96 + 0.5)) * auVar83._4_4_ + 1.0;
        auVar100._24_4_ =
             (fVar97 + 1.0 +
             fVar97 * fVar97 *
             (((((fVar97 * 0.00019875691 + 0.0013981999) * fVar97 + 0.008333452) * fVar97 +
               0.041665796) * fVar97 + 0.16666666) * fVar97 + 0.5)) * auVar83._8_4_ + 1.0;
        auVar100._28_4_ = auVar75._28_4_ + 1.0 + auVar84._28_4_ + 1.0;
        auVar84 = vrcpps_avx(auVar100);
        pfVar62 = (float *)((long)gates.data + lVar25 + lVar28 * 3);
        auVar11._4_4_ = pfVar62[1] * -2.0;
        auVar11._0_4_ = *pfVar62 * -2.0;
        auVar11._8_4_ = pfVar62[2] * -2.0;
        auVar11._12_4_ = pfVar62[3] * -2.0;
        auVar11._16_4_ = pfVar62[4] * -2.0;
        auVar11._20_4_ = pfVar62[5] * -2.0;
        auVar11._24_4_ = pfVar62[6] * -2.0;
        auVar11._28_4_ = 0xc0000000;
        auVar74 = vminps_avx(auVar139,auVar11);
        auVar75 = vmaxps_avx(auVar74,auVar140);
        auVar106._0_4_ = auVar75._0_4_ * 1.442695 + 0.5;
        auVar106._4_4_ = auVar75._4_4_ * 1.442695 + 0.5;
        auVar106._8_4_ = auVar75._8_4_ * 1.442695 + 0.5;
        auVar106._12_4_ = auVar75._12_4_ * 1.442695 + 0.5;
        auVar106._16_4_ = auVar75._16_4_ * 1.442695 + 0.5;
        auVar106._20_4_ = auVar75._20_4_ * 1.442695 + 0.5;
        auVar106._24_4_ = auVar75._24_4_ * 1.442695 + 0.5;
        auVar106._28_4_ =
             in_ZMM3._28_4_ + 0.0013981999 + 0.008333452 + 0.041665796 + 0.16666666 + 0.5 + 0.5;
        auVar73 = vroundps_avx(auVar106,1);
        auVar74 = vcmpps_avx(auVar106,auVar73,1);
        auVar74 = vandps_avx(auVar156,auVar74);
        auVar74 = vsubps_avx(auVar73,auVar74);
        auVar12._4_4_ = auVar74._4_4_ * 0.6931472;
        auVar12._0_4_ = auVar74._0_4_ * 0.6931472;
        auVar12._8_4_ = auVar74._8_4_ * 0.6931472;
        auVar12._12_4_ = auVar74._12_4_ * 0.6931472;
        auVar12._16_4_ = auVar74._16_4_ * 0.6931472;
        auVar12._20_4_ = auVar74._20_4_ * 0.6931472;
        auVar12._24_4_ = auVar74._24_4_ * 0.6931472;
        auVar12._28_4_ = auVar73._28_4_;
        auVar75 = vsubps_avx(auVar75,auVar12);
        fVar98 = auVar75._0_4_;
        fVar81 = auVar75._4_4_;
        fVar93 = auVar75._8_4_;
        fVar94 = auVar75._12_4_;
        fVar95 = auVar75._16_4_;
        fVar96 = auVar75._20_4_;
        fVar97 = auVar75._24_4_;
        in_ZMM9 = ZEXT3264(CONCAT428(0x3f000000,
                                     CONCAT424(0x3f000000,
                                               CONCAT420(0x3f000000,
                                                         CONCAT416(0x3f000000,
                                                                   CONCAT412(0x3f000000,
                                                                             CONCAT48(0x3f000000,
                                                                                                                                                                            
                                                  0x3f0000003f000000)))))));
        auVar103._0_4_ = (int)auVar74._0_4_;
        auVar103._4_4_ = (int)auVar74._4_4_;
        auVar103._8_4_ = (int)auVar74._8_4_;
        auVar103._12_4_ = (int)auVar74._12_4_;
        auVar107._16_4_ = (int)auVar74._16_4_;
        auVar107._0_16_ = auVar103;
        auVar107._20_4_ = (int)auVar74._20_4_;
        auVar107._24_4_ = (int)auVar74._24_4_;
        auVar107._28_4_ = (int)auVar74._28_4_;
        auVar99 = vpslld_avx(auVar103,0x17);
        auVar83 = vpslld_avx(auVar107._16_16_,0x17);
        auVar83 = vpaddd_avx(auVar83,auVar137);
        auVar99 = vpaddd_avx(auVar99,auVar137);
        auVar77._0_4_ =
             (fVar98 + 1.0 +
             fVar98 * fVar98 *
             (((((fVar98 * 0.00019875691 + 0.0013981999) * fVar98 + 0.008333452) * fVar98 +
               0.041665796) * fVar98 + 0.16666666) * fVar98 + 0.5)) * auVar99._0_4_ + 1.0;
        auVar77._4_4_ =
             (fVar81 + 1.0 +
             fVar81 * fVar81 *
             (((((fVar81 * 0.00019875691 + 0.0013981999) * fVar81 + 0.008333452) * fVar81 +
               0.041665796) * fVar81 + 0.16666666) * fVar81 + 0.5)) * auVar99._4_4_ + 1.0;
        auVar77._8_4_ =
             (fVar93 + 1.0 +
             fVar93 * fVar93 *
             (((((fVar93 * 0.00019875691 + 0.0013981999) * fVar93 + 0.008333452) * fVar93 +
               0.041665796) * fVar93 + 0.16666666) * fVar93 + 0.5)) * auVar99._8_4_ + 1.0;
        auVar77._12_4_ =
             (fVar94 + 1.0 +
             fVar94 * fVar94 *
             (((((fVar94 * 0.00019875691 + 0.0013981999) * fVar94 + 0.008333452) * fVar94 +
               0.041665796) * fVar94 + 0.16666666) * fVar94 + 0.5)) * auVar99._12_4_ + 1.0;
        auVar77._16_4_ =
             (fVar95 + 1.0 +
             fVar95 * fVar95 *
             (((((fVar95 * 0.00019875691 + 0.0013981999) * fVar95 + 0.008333452) * fVar95 +
               0.041665796) * fVar95 + 0.16666666) * fVar95 + 0.5)) * auVar83._0_4_ + 1.0;
        auVar77._20_4_ =
             (fVar96 + 1.0 +
             fVar96 * fVar96 *
             (((((fVar96 * 0.00019875691 + 0.0013981999) * fVar96 + 0.008333452) * fVar96 +
               0.041665796) * fVar96 + 0.16666666) * fVar96 + 0.5)) * auVar83._4_4_ + 1.0;
        auVar77._24_4_ =
             (fVar97 + 1.0 +
             fVar97 * fVar97 *
             (((((fVar97 * 0.00019875691 + 0.0013981999) * fVar97 + 0.008333452) * fVar97 +
               0.041665796) * fVar97 + 0.16666666) * fVar97 + 0.5)) * auVar83._8_4_ + 1.0;
        auVar77._28_4_ = auVar75._28_4_ + 1.0 + auVar73._28_4_ + 1.0;
        auVar74 = vrcpps_avx(auVar77);
        fVar98 = auVar74._0_4_;
        fVar81 = auVar74._4_4_;
        fVar93 = auVar74._8_4_;
        fVar94 = auVar74._12_4_;
        fVar95 = auVar74._16_4_;
        fVar96 = auVar74._20_4_;
        fVar97 = auVar74._24_4_;
        fVar124 = auVar74._28_4_ + auVar74._28_4_;
        auVar13._4_4_ = auVar77._4_4_ * (fVar81 + fVar81);
        auVar13._0_4_ = auVar77._0_4_ * (fVar98 + fVar98);
        auVar13._8_4_ = auVar77._8_4_ * (fVar93 + fVar93);
        auVar13._12_4_ = auVar77._12_4_ * (fVar94 + fVar94);
        auVar13._16_4_ = auVar77._16_4_ * (fVar95 + fVar95);
        auVar13._20_4_ = auVar77._20_4_ * (fVar96 + fVar96);
        auVar13._24_4_ = auVar77._24_4_ * (fVar97 + fVar97);
        auVar13._28_4_ = auVar77._28_4_;
        auVar125._8_4_ = 0x40000000;
        auVar125._0_8_ = 0x4000000040000000;
        auVar125._12_4_ = 0x40000000;
        auVar125._16_4_ = 0x40000000;
        auVar125._20_4_ = 0x40000000;
        auVar125._24_4_ = 0x40000000;
        auVar125._28_4_ = 0x40000000;
        auVar74 = vsubps_avx(auVar125,auVar13);
        auVar108._0_4_ = fVar98 + fVar98 + -1.0 + fVar98 * auVar74._0_4_;
        auVar108._4_4_ = fVar81 + fVar81 + -1.0 + fVar81 * auVar74._4_4_;
        auVar108._8_4_ = fVar93 + fVar93 + -1.0 + fVar93 * auVar74._8_4_;
        auVar108._12_4_ = fVar94 + fVar94 + -1.0 + fVar94 * auVar74._12_4_;
        auVar108._16_4_ = fVar95 + fVar95 + -1.0 + fVar95 * auVar74._16_4_;
        auVar108._20_4_ = fVar96 + fVar96 + -1.0 + fVar96 * auVar74._20_4_;
        auVar108._24_4_ = fVar97 + fVar97 + -1.0 + fVar97 * auVar74._24_4_;
        auVar108._28_4_ = fVar124 + -1.0 + auVar74._28_4_;
        fVar149 = auVar108._0_4_ * auVar84._0_4_;
        fVar150 = auVar108._4_4_ * auVar84._4_4_;
        fVar151 = auVar108._8_4_ * auVar84._8_4_;
        fVar152 = auVar108._12_4_ * auVar84._12_4_;
        fVar153 = auVar108._16_4_ * auVar84._16_4_;
        fVar154 = auVar108._20_4_ * auVar84._20_4_;
        fVar155 = auVar108._24_4_ * auVar84._24_4_;
        auVar14._4_4_ = fVar150 * auVar100._4_4_;
        auVar14._0_4_ = fVar149 * auVar100._0_4_;
        auVar14._8_4_ = fVar151 * auVar100._8_4_;
        auVar14._12_4_ = fVar152 * auVar100._12_4_;
        auVar14._16_4_ = fVar153 * auVar100._16_4_;
        auVar14._20_4_ = fVar154 * auVar100._20_4_;
        auVar14._24_4_ = fVar155 * auVar100._24_4_;
        auVar14._28_4_ = auVar100._28_4_;
        auVar10 = vsubps_avx(auVar108,auVar14);
        auVar74 = *(undefined1 (*) [32])((long)gates.data + lVar25 + lVar28);
        auVar109._0_8_ = auVar74._0_8_ ^ 0x8000000080000000;
        auVar109._8_4_ = auVar74._8_4_ ^ 0x80000000;
        auVar109._12_4_ = auVar74._12_4_ ^ 0x80000000;
        auVar109._16_4_ = auVar74._16_4_ ^ 0x80000000;
        auVar109._20_4_ = auVar74._20_4_ ^ 0x80000000;
        auVar109._24_4_ = auVar74._24_4_ ^ 0x80000000;
        auVar109._28_4_ = auVar74._28_4_ ^ 0x80000000;
        auVar78._8_4_ = 0x42b0c0a5;
        auVar78._0_8_ = 0x42b0c0a542b0c0a5;
        auVar78._12_4_ = 0x42b0c0a5;
        auVar78._16_4_ = 0x42b0c0a5;
        auVar78._20_4_ = 0x42b0c0a5;
        auVar78._24_4_ = 0x42b0c0a5;
        auVar78._28_4_ = 0x42b0c0a5;
        auVar74 = vminps_avx(auVar109,auVar78);
        auVar75 = vmaxps_avx(auVar140,auVar74);
        auVar118._0_4_ = auVar75._0_4_ * 1.442695 + 0.5;
        auVar118._4_4_ = auVar75._4_4_ * 1.442695 + 0.5;
        auVar118._8_4_ = auVar75._8_4_ * 1.442695 + 0.5;
        auVar118._12_4_ = auVar75._12_4_ * 1.442695 + 0.5;
        auVar118._16_4_ = auVar75._16_4_ * 1.442695 + 0.5;
        auVar118._20_4_ = auVar75._20_4_ * 1.442695 + 0.5;
        auVar118._24_4_ = auVar75._24_4_ * 1.442695 + 0.5;
        auVar118._28_4_ = fVar124 + 0.5;
        auVar73 = vroundps_avx(auVar118,1);
        auVar74 = vcmpps_avx(auVar118,auVar73,1);
        auVar74 = vandps_avx(auVar156,auVar74);
        auVar74 = vsubps_avx(auVar73,auVar74);
        auVar15._4_4_ = auVar74._4_4_ * 0.6931472;
        auVar15._0_4_ = auVar74._0_4_ * 0.6931472;
        auVar15._8_4_ = auVar74._8_4_ * 0.6931472;
        auVar15._12_4_ = auVar74._12_4_ * 0.6931472;
        auVar15._16_4_ = auVar74._16_4_ * 0.6931472;
        auVar15._20_4_ = auVar74._20_4_ * 0.6931472;
        auVar15._24_4_ = auVar74._24_4_ * 0.6931472;
        auVar15._28_4_ = auVar73._28_4_;
        auVar75 = vsubps_avx(auVar75,auVar15);
        fVar98 = auVar75._0_4_;
        fVar81 = auVar75._4_4_;
        fVar93 = auVar75._8_4_;
        fVar94 = auVar75._12_4_;
        fVar95 = auVar75._16_4_;
        fVar96 = auVar75._20_4_;
        fVar97 = auVar75._24_4_;
        auVar115._0_4_ = (int)auVar74._0_4_;
        auVar115._4_4_ = (int)auVar74._4_4_;
        auVar115._8_4_ = (int)auVar74._8_4_;
        auVar115._12_4_ = (int)auVar74._12_4_;
        auVar119._16_4_ = (int)auVar74._16_4_;
        auVar119._0_16_ = auVar115;
        auVar119._20_4_ = (int)auVar74._20_4_;
        auVar119._24_4_ = (int)auVar74._24_4_;
        auVar119._28_4_ = (int)auVar74._28_4_;
        auVar99 = vpslld_avx(auVar115,0x17);
        auVar83 = vpslld_avx(auVar119._16_16_,0x17);
        auVar83 = vpaddd_avx(auVar83,auVar137);
        auVar99 = vpaddd_avx(auVar99,auVar137);
        auVar110._0_4_ =
             (fVar98 + 1.0 +
             fVar98 * fVar98 *
             (((((fVar98 * 0.00019875691 + 0.0013981999) * fVar98 + 0.008333452) * fVar98 +
               0.041665796) * fVar98 + 0.16666666) * fVar98 + 0.5)) * auVar99._0_4_ + 1.0;
        auVar110._4_4_ =
             (fVar81 + 1.0 +
             fVar81 * fVar81 *
             (((((fVar81 * 0.00019875691 + 0.0013981999) * fVar81 + 0.008333452) * fVar81 +
               0.041665796) * fVar81 + 0.16666666) * fVar81 + 0.5)) * auVar99._4_4_ + 1.0;
        auVar110._8_4_ =
             (fVar93 + 1.0 +
             fVar93 * fVar93 *
             (((((fVar93 * 0.00019875691 + 0.0013981999) * fVar93 + 0.008333452) * fVar93 +
               0.041665796) * fVar93 + 0.16666666) * fVar93 + 0.5)) * auVar99._8_4_ + 1.0;
        auVar110._12_4_ =
             (fVar94 + 1.0 +
             fVar94 * fVar94 *
             (((((fVar94 * 0.00019875691 + 0.0013981999) * fVar94 + 0.008333452) * fVar94 +
               0.041665796) * fVar94 + 0.16666666) * fVar94 + 0.5)) * auVar99._12_4_ + 1.0;
        auVar110._16_4_ =
             (fVar95 + 1.0 +
             fVar95 * fVar95 *
             (((((fVar95 * 0.00019875691 + 0.0013981999) * fVar95 + 0.008333452) * fVar95 +
               0.041665796) * fVar95 + 0.16666666) * fVar95 + 0.5)) * auVar83._0_4_ + 1.0;
        auVar110._20_4_ =
             (fVar96 + 1.0 +
             fVar96 * fVar96 *
             (((((fVar96 * 0.00019875691 + 0.0013981999) * fVar96 + 0.008333452) * fVar96 +
               0.041665796) * fVar96 + 0.16666666) * fVar96 + 0.5)) * auVar83._4_4_ + 1.0;
        auVar110._24_4_ =
             (fVar97 + 1.0 +
             fVar97 * fVar97 *
             (((((fVar97 * 0.00019875691 + 0.0013981999) * fVar97 + 0.008333452) * fVar97 +
               0.041665796) * fVar97 + 0.16666666) * fVar97 + 0.5)) * auVar83._8_4_ + 1.0;
        auVar110._28_4_ = auVar75._28_4_ + 1.0 + auVar73._28_4_ + 1.0;
        auVar73 = vrcpps_avx(auVar110);
        fVar141 = auVar84._0_4_ * auVar10._0_4_;
        fVar142 = auVar84._4_4_ * auVar10._4_4_;
        fVar143 = auVar84._8_4_ * auVar10._8_4_;
        fVar144 = auVar84._12_4_ * auVar10._12_4_;
        fVar145 = auVar84._16_4_ * auVar10._16_4_;
        fVar146 = auVar84._20_4_ * auVar10._20_4_;
        fVar147 = auVar84._24_4_ * auVar10._24_4_;
        in_ZMM10 = ZEXT3264(CONCAT428(0x3fb8aa3b,
                                      CONCAT424(fVar147,CONCAT420(fVar146,CONCAT416(fVar145,
                                                  CONCAT412(fVar144,CONCAT48(fVar143,CONCAT44(
                                                  fVar142,fVar141))))))));
        auVar74 = *(undefined1 (*) [32])((long)pvVar6 + lVar25);
        fVar81 = auVar74._0_4_ * auVar73._0_4_;
        fVar94 = auVar74._4_4_ * auVar73._4_4_;
        fVar96 = auVar74._8_4_ * auVar73._8_4_;
        fVar124 = auVar74._12_4_ * auVar73._12_4_;
        fVar127 = auVar74._16_4_ * auVar73._16_4_;
        fVar128 = auVar74._20_4_ * auVar73._20_4_;
        fVar129 = auVar74._24_4_ * auVar73._24_4_;
        auVar16._4_4_ = auVar110._4_4_ * fVar94;
        auVar16._0_4_ = auVar110._0_4_ * fVar81;
        auVar16._8_4_ = auVar110._8_4_ * fVar96;
        auVar16._12_4_ = auVar110._12_4_ * fVar124;
        auVar16._16_4_ = auVar110._16_4_ * fVar127;
        auVar16._20_4_ = auVar110._20_4_ * fVar128;
        auVar16._24_4_ = auVar110._24_4_ * fVar129;
        auVar16._28_4_ = auVar110._28_4_;
        auVar10 = vsubps_avx(auVar74,auVar16);
        auVar74 = *(undefined1 (*) [32])((long)gates.data + lVar25 + lVar28 * 2);
        auVar120._0_8_ = auVar74._0_8_ ^ 0x8000000080000000;
        auVar120._8_4_ = auVar74._8_4_ ^ 0x80000000;
        auVar120._12_4_ = auVar74._12_4_ ^ 0x80000000;
        auVar120._16_4_ = auVar74._16_4_ ^ 0x80000000;
        auVar120._20_4_ = auVar74._20_4_ ^ 0x80000000;
        auVar120._24_4_ = auVar74._24_4_ ^ 0x80000000;
        auVar120._28_4_ = -auVar74._28_4_;
        auVar87._8_4_ = 0x42b0c0a5;
        auVar87._0_8_ = 0x42b0c0a542b0c0a5;
        auVar87._12_4_ = 0x42b0c0a5;
        auVar87._16_4_ = 0x42b0c0a5;
        auVar87._20_4_ = 0x42b0c0a5;
        auVar87._24_4_ = 0x42b0c0a5;
        auVar87._28_4_ = 0x42b0c0a5;
        auVar74 = vminps_avx(auVar120,auVar87);
        auVar88._8_4_ = 0xc2b0c0a5;
        auVar88._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar88._12_4_ = 0xc2b0c0a5;
        auVar88._16_4_ = 0xc2b0c0a5;
        auVar88._20_4_ = 0xc2b0c0a5;
        auVar88._24_4_ = 0xc2b0c0a5;
        auVar88._28_4_ = 0xc2b0c0a5;
        auVar75 = vmaxps_avx(auVar74,auVar88);
        auVar121._0_4_ = auVar75._0_4_ * 1.442695 + 0.5;
        auVar121._4_4_ = auVar75._4_4_ * 1.442695 + 0.5;
        auVar121._8_4_ = auVar75._8_4_ * 1.442695 + 0.5;
        auVar121._12_4_ = auVar75._12_4_ * 1.442695 + 0.5;
        auVar121._16_4_ = auVar75._16_4_ * 1.442695 + 0.5;
        auVar121._20_4_ = auVar75._20_4_ * 1.442695 + 0.5;
        auVar121._24_4_ = auVar75._24_4_ * 1.442695 + 0.5;
        auVar121._28_4_ = auVar120._28_4_ + 0.5;
        auVar84 = vroundps_avx(auVar121,1);
        auVar74 = vcmpps_avx(auVar121,auVar84,1);
        auVar74 = vandps_avx(auVar156,auVar74);
        auVar74 = vsubps_avx(auVar84,auVar74);
        auVar17._4_4_ = auVar74._4_4_ * 0.6931472;
        auVar17._0_4_ = auVar74._0_4_ * 0.6931472;
        auVar17._8_4_ = auVar74._8_4_ * 0.6931472;
        auVar17._12_4_ = auVar74._12_4_ * 0.6931472;
        auVar17._16_4_ = auVar74._16_4_ * 0.6931472;
        auVar17._20_4_ = auVar74._20_4_ * 0.6931472;
        auVar17._24_4_ = auVar74._24_4_ * 0.6931472;
        auVar17._28_4_ = auVar84._28_4_;
        auVar11 = vsubps_avx(auVar75,auVar17);
        fVar98 = auVar11._0_4_;
        fVar93 = auVar11._4_4_;
        fVar95 = auVar11._8_4_;
        fVar97 = auVar11._12_4_;
        fVar148 = auVar11._16_4_;
        fVar8 = auVar11._20_4_;
        fVar9 = auVar11._24_4_;
        fVar130 = ((((fVar98 * 0.00019875691 + 0.0013981999) * fVar98 + 0.008333452) * fVar98 +
                   0.041665796) * fVar98 + 0.16666666) * fVar98 + 0.5;
        fVar131 = ((((fVar93 * 0.00019875691 + 0.0013981999) * fVar93 + 0.008333452) * fVar93 +
                   0.041665796) * fVar93 + 0.16666666) * fVar93 + 0.5;
        fVar132 = ((((fVar95 * 0.00019875691 + 0.0013981999) * fVar95 + 0.008333452) * fVar95 +
                   0.041665796) * fVar95 + 0.16666666) * fVar95 + 0.5;
        fVar133 = ((((fVar97 * 0.00019875691 + 0.0013981999) * fVar97 + 0.008333452) * fVar97 +
                   0.041665796) * fVar97 + 0.16666666) * fVar97 + 0.5;
        fVar134 = ((((fVar148 * 0.00019875691 + 0.0013981999) * fVar148 + 0.008333452) * fVar148 +
                   0.041665796) * fVar148 + 0.16666666) * fVar148 + 0.5;
        fVar135 = ((((fVar8 * 0.00019875691 + 0.0013981999) * fVar8 + 0.008333452) * fVar8 +
                   0.041665796) * fVar8 + 0.16666666) * fVar8 + 0.5;
        fVar136 = ((((fVar9 * 0.00019875691 + 0.0013981999) * fVar9 + 0.008333452) * fVar9 +
                   0.041665796) * fVar9 + 0.16666666) * fVar9 + 0.5;
        in_ZMM6 = ZEXT3264(CONCAT428(0x3fbd285a,
                                     CONCAT424(fVar136,CONCAT420(fVar135,CONCAT416(fVar134,CONCAT412
                                                  (fVar133,CONCAT48(fVar132,CONCAT44(fVar131,fVar130
                                                                                    ))))))));
        auVar116._0_4_ = (int)auVar74._0_4_;
        auVar116._4_4_ = (int)auVar74._4_4_;
        auVar116._8_4_ = (int)auVar74._8_4_;
        auVar116._12_4_ = (int)auVar74._12_4_;
        auVar122._16_4_ = (int)auVar74._16_4_;
        auVar122._0_16_ = auVar116;
        auVar122._20_4_ = (int)auVar74._20_4_;
        auVar122._24_4_ = (int)auVar74._24_4_;
        auVar122._28_4_ = (int)auVar74._28_4_;
        auVar99 = vpslld_avx(auVar116,0x17);
        auVar83 = vpslld_avx(auVar122._16_16_,0x17);
        auVar83 = vpaddd_avx(auVar83,auVar137);
        auVar99 = vpaddd_avx(auVar99,auVar137);
        auVar79._0_4_ = fVar141 + fVar149 + fVar81 + auVar73._0_4_ * auVar10._0_4_;
        auVar79._4_4_ = fVar142 + fVar150 + fVar94 + auVar73._4_4_ * auVar10._4_4_;
        auVar79._8_4_ = fVar143 + fVar151 + fVar96 + auVar73._8_4_ * auVar10._8_4_;
        auVar79._12_4_ = fVar144 + fVar152 + fVar124 + auVar73._12_4_ * auVar10._12_4_;
        auVar79._16_4_ = fVar145 + fVar153 + fVar127 + auVar73._16_4_ * auVar10._16_4_;
        auVar79._20_4_ = fVar146 + fVar154 + fVar128 + auVar73._20_4_ * auVar10._20_4_;
        auVar79._24_4_ = fVar147 + fVar155 + fVar129 + auVar73._24_4_ * auVar10._24_4_;
        auVar79._28_4_ = auVar10._28_4_ + 0.0 + 0.5 + 1.442695;
        auVar18._4_4_ = auVar79._4_4_ * -2.0;
        auVar18._0_4_ = auVar79._0_4_ * -2.0;
        auVar18._8_4_ = auVar79._8_4_ * -2.0;
        auVar18._12_4_ = auVar79._12_4_ * -2.0;
        auVar18._16_4_ = auVar79._16_4_ * -2.0;
        auVar18._20_4_ = auVar79._20_4_ * -2.0;
        auVar18._24_4_ = auVar79._24_4_ * -2.0;
        auVar18._28_4_ = 0xc0000000;
        auVar111._8_4_ = 0x42b0c0a5;
        auVar111._0_8_ = 0x42b0c0a542b0c0a5;
        auVar111._12_4_ = 0x42b0c0a5;
        auVar111._16_4_ = 0x42b0c0a5;
        auVar111._20_4_ = 0x42b0c0a5;
        auVar111._24_4_ = 0x42b0c0a5;
        auVar111._28_4_ = 0x42b0c0a5;
        auVar74 = vminps_avx(auVar18,auVar111);
        auVar112._8_4_ = 0xc2b0c0a5;
        auVar112._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar112._12_4_ = 0xc2b0c0a5;
        auVar112._16_4_ = 0xc2b0c0a5;
        auVar112._20_4_ = 0xc2b0c0a5;
        auVar112._24_4_ = 0xc2b0c0a5;
        auVar112._28_4_ = 0xc2b0c0a5;
        auVar75 = vmaxps_avx(auVar74,auVar112);
        auVar113._0_4_ = auVar75._0_4_ * 1.442695 + 0.5;
        auVar113._4_4_ = auVar75._4_4_ * 1.442695 + 0.5;
        auVar113._8_4_ = auVar75._8_4_ * 1.442695 + 0.5;
        auVar113._12_4_ = auVar75._12_4_ * 1.442695 + 0.5;
        auVar113._16_4_ = auVar75._16_4_ * 1.442695 + 0.5;
        auVar113._20_4_ = auVar75._20_4_ * 1.442695 + 0.5;
        auVar113._24_4_ = auVar75._24_4_ * 1.442695 + 0.5;
        auVar113._28_4_ = 0xc2afc0a5;
        auVar73 = vroundps_avx(auVar113,1);
        auVar74 = vcmpps_avx(auVar113,auVar73,1);
        auVar74 = vandps_avx(auVar156,auVar74);
        auVar74 = vsubps_avx(auVar73,auVar74);
        auVar19._4_4_ = auVar74._4_4_ * 0.6931472;
        auVar19._0_4_ = auVar74._0_4_ * 0.6931472;
        auVar19._8_4_ = auVar74._8_4_ * 0.6931472;
        auVar19._12_4_ = auVar74._12_4_ * 0.6931472;
        auVar19._16_4_ = auVar74._16_4_ * 0.6931472;
        auVar19._20_4_ = auVar74._20_4_ * 0.6931472;
        auVar19._24_4_ = auVar74._24_4_ * 0.6931472;
        auVar19._28_4_ = 0x3f317218;
        auVar75 = vsubps_avx(auVar75,auVar19);
        fVar81 = auVar75._0_4_;
        fVar94 = auVar75._4_4_;
        fVar96 = auVar75._8_4_;
        fVar124 = auVar75._12_4_;
        fVar127 = auVar75._16_4_;
        fVar128 = auVar75._20_4_;
        fVar129 = auVar75._24_4_;
        auVar104._0_4_ = (int)auVar74._0_4_;
        auVar104._4_4_ = (int)auVar74._4_4_;
        auVar104._8_4_ = (int)auVar74._8_4_;
        auVar104._12_4_ = (int)auVar74._12_4_;
        auVar114._16_4_ = (int)auVar74._16_4_;
        auVar114._0_16_ = auVar104;
        auVar114._20_4_ = (int)auVar74._20_4_;
        auVar114._24_4_ = (int)auVar74._24_4_;
        auVar114._28_4_ = (int)auVar74._28_4_;
        auVar117 = vpslld_avx(auVar104,0x17);
        auVar105 = vpslld_avx(auVar114._16_16_,0x17);
        auVar105 = vpaddd_avx(auVar105,auVar137);
        auVar117 = vpaddd_avx(auVar117,auVar137);
        auVar89._0_4_ =
             (fVar81 + 1.0 +
             fVar81 * fVar81 *
             (((((fVar81 * 0.00019875691 + 0.0013981999) * fVar81 + 0.008333452) * fVar81 +
               0.041665796) * fVar81 + 0.16666666) * fVar81 + 0.5)) * auVar117._0_4_ + 1.0;
        auVar89._4_4_ =
             (fVar94 + 1.0 +
             fVar94 * fVar94 *
             (((((fVar94 * 0.00019875691 + 0.0013981999) * fVar94 + 0.008333452) * fVar94 +
               0.041665796) * fVar94 + 0.16666666) * fVar94 + 0.5)) * auVar117._4_4_ + 1.0;
        auVar89._8_4_ =
             (fVar96 + 1.0 +
             fVar96 * fVar96 *
             (((((fVar96 * 0.00019875691 + 0.0013981999) * fVar96 + 0.008333452) * fVar96 +
               0.041665796) * fVar96 + 0.16666666) * fVar96 + 0.5)) * auVar117._8_4_ + 1.0;
        auVar89._12_4_ =
             (fVar124 + 1.0 +
             fVar124 * fVar124 *
             (((((fVar124 * 0.00019875691 + 0.0013981999) * fVar124 + 0.008333452) * fVar124 +
               0.041665796) * fVar124 + 0.16666666) * fVar124 + 0.5)) * auVar117._12_4_ + 1.0;
        auVar89._16_4_ =
             (fVar127 + 1.0 +
             fVar127 * fVar127 *
             (((((fVar127 * 0.00019875691 + 0.0013981999) * fVar127 + 0.008333452) * fVar127 +
               0.041665796) * fVar127 + 0.16666666) * fVar127 + 0.5)) * auVar105._0_4_ + 1.0;
        auVar89._20_4_ =
             (fVar128 + 1.0 +
             fVar128 * fVar128 *
             (((((fVar128 * 0.00019875691 + 0.0013981999) * fVar128 + 0.008333452) * fVar128 +
               0.041665796) * fVar128 + 0.16666666) * fVar128 + 0.5)) * auVar105._4_4_ + 1.0;
        auVar89._24_4_ =
             (fVar129 + 1.0 +
             fVar129 * fVar129 *
             (((((fVar129 * 0.00019875691 + 0.0013981999) * fVar129 + 0.008333452) * fVar129 +
               0.041665796) * fVar129 + 0.16666666) * fVar129 + 0.5)) * auVar105._8_4_ + 1.0;
        auVar89._28_4_ = auVar75._28_4_ + 1.0 + 0.6931472 + 1.0;
        auVar74 = vrcpps_avx(auVar89);
        auVar101._0_4_ = (fVar98 + 1.0 + fVar98 * fVar98 * fVar130) * auVar99._0_4_ + 1.0;
        auVar101._4_4_ = (fVar93 + 1.0 + fVar93 * fVar93 * fVar131) * auVar99._4_4_ + 1.0;
        auVar101._8_4_ = (fVar95 + 1.0 + fVar95 * fVar95 * fVar132) * auVar99._8_4_ + 1.0;
        auVar101._12_4_ = (fVar97 + 1.0 + fVar97 * fVar97 * fVar133) * auVar99._12_4_ + 1.0;
        auVar101._16_4_ = (fVar148 + 1.0 + fVar148 * fVar148 * fVar134) * auVar83._0_4_ + 1.0;
        auVar101._20_4_ = (fVar8 + 1.0 + fVar8 * fVar8 * fVar135) * auVar83._4_4_ + 1.0;
        auVar101._24_4_ = (fVar9 + 1.0 + fVar9 * fVar9 * fVar136) * auVar83._8_4_ + 1.0;
        auVar101._28_4_ = auVar11._28_4_ + 1.0 + auVar84._28_4_ + 1.0;
        fVar98 = auVar74._0_4_;
        fVar81 = auVar74._4_4_;
        fVar93 = auVar74._8_4_;
        fVar94 = auVar74._12_4_;
        fVar95 = auVar74._16_4_;
        fVar96 = auVar74._20_4_;
        fVar97 = auVar74._24_4_;
        auVar20._4_4_ = auVar89._4_4_ * (fVar81 + fVar81);
        auVar20._0_4_ = auVar89._0_4_ * (fVar98 + fVar98);
        auVar20._8_4_ = auVar89._8_4_ * (fVar93 + fVar93);
        auVar20._12_4_ = auVar89._12_4_ * (fVar94 + fVar94);
        auVar20._16_4_ = auVar89._16_4_ * (fVar95 + fVar95);
        auVar20._20_4_ = auVar89._20_4_ * (fVar96 + fVar96);
        auVar20._24_4_ = auVar89._24_4_ * (fVar97 + fVar97);
        auVar20._28_4_ = auVar89._28_4_;
        auVar126._8_4_ = 0x40000000;
        auVar126._0_8_ = 0x4000000040000000;
        auVar126._12_4_ = 0x40000000;
        auVar126._16_4_ = 0x40000000;
        auVar126._20_4_ = 0x40000000;
        auVar126._24_4_ = 0x40000000;
        auVar126._28_4_ = 0x40000000;
        auVar84 = vsubps_avx(auVar126,auVar20);
        auVar75 = vrcpps_avx(auVar101);
        in_ZMM3 = ZEXT3264(auVar75);
        in_ZMM5 = ZEXT3264(CONCAT428(0xbf800000,
                                     CONCAT424(0xbf800000,
                                               CONCAT420(0xbf800000,
                                                         CONCAT416(0xbf800000,
                                                                   CONCAT412(0xbf800000,
                                                                             CONCAT48(0xbf800000,
                                                                                                                                                                            
                                                  0xbf800000bf800000)))))));
        fVar124 = auVar74._28_4_ + auVar74._28_4_ + -1.0;
        auVar90._0_4_ = fVar98 + fVar98 + -1.0 + fVar98 * auVar84._0_4_;
        auVar90._4_4_ = fVar81 + fVar81 + -1.0 + fVar81 * auVar84._4_4_;
        auVar90._8_4_ = fVar93 + fVar93 + -1.0 + fVar93 * auVar84._8_4_;
        auVar90._12_4_ = fVar94 + fVar94 + -1.0 + fVar94 * auVar84._12_4_;
        auVar90._16_4_ = fVar95 + fVar95 + -1.0 + fVar95 * auVar84._16_4_;
        auVar90._20_4_ = fVar96 + fVar96 + -1.0 + fVar96 * auVar84._20_4_;
        auVar90._24_4_ = fVar97 + fVar97 + -1.0 + fVar97 * auVar84._24_4_;
        auVar90._28_4_ = fVar124 + auVar84._28_4_;
        fVar98 = auVar90._0_4_ * auVar75._0_4_;
        fVar81 = auVar90._4_4_ * auVar75._4_4_;
        fVar93 = auVar90._8_4_ * auVar75._8_4_;
        fVar94 = auVar90._12_4_ * auVar75._12_4_;
        fVar95 = auVar90._16_4_ * auVar75._16_4_;
        fVar96 = auVar90._20_4_ * auVar75._20_4_;
        fVar97 = auVar90._24_4_ * auVar75._24_4_;
        auVar21._4_4_ = auVar101._4_4_ * fVar81;
        auVar21._0_4_ = auVar101._0_4_ * fVar98;
        auVar21._8_4_ = auVar101._8_4_ * fVar93;
        auVar21._12_4_ = auVar101._12_4_ * fVar94;
        auVar21._16_4_ = auVar101._16_4_ * fVar95;
        auVar21._20_4_ = auVar101._20_4_ * fVar96;
        auVar21._24_4_ = auVar101._24_4_ * fVar97;
        auVar21._28_4_ = auVar101._28_4_;
        auVar74 = vsubps_avx(auVar90,auVar21);
        auVar91._0_4_ = fVar98 + auVar75._0_4_ * auVar74._0_4_;
        auVar91._4_4_ = fVar81 + auVar75._4_4_ * auVar74._4_4_;
        auVar91._8_4_ = fVar93 + auVar75._8_4_ * auVar74._8_4_;
        auVar91._12_4_ = fVar94 + auVar75._12_4_ * auVar74._12_4_;
        auVar91._16_4_ = fVar95 + auVar75._16_4_ * auVar74._16_4_;
        auVar91._20_4_ = fVar96 + auVar75._20_4_ * auVar74._20_4_;
        auVar91._24_4_ = fVar97 + auVar75._24_4_ * auVar74._24_4_;
        auVar91._28_4_ = fVar124 + auVar74._28_4_;
        in_ZMM1 = ZEXT3264(auVar91);
        *(undefined1 (*) [32])((long)pvVar6 + lVar25) = auVar79;
        *(undefined1 (*) [32])((long)pvVar63 + lVar25) = auVar91;
        *(undefined1 (*) [32])((long)pvVar5 + lVar25 + lVar29) = auVar91;
        lVar25 = lVar25 + 0x20;
      }
      for (; 0 < (int)uVar23; uVar23 = uVar23 - 1) {
        fVar98 = *(float *)((long)pvVar22 + lVar25 + lVar28 * 3);
        in_ZMM3 = ZEXT1664(in_ZMM3._0_16_);
        in_ZMM5 = ZEXT1664(in_ZMM5._0_16_);
        in_ZMM6 = ZEXT1664(in_ZMM6._0_16_);
        in_ZMM9 = ZEXT1664(in_ZMM9._0_16_);
        in_ZMM10 = ZEXT1664(in_ZMM10._0_16_);
        fVar81 = expf(-*(float *)((long)pvVar22 + lVar25));
        fVar93 = expf(-*(float *)((long)pvVar22 + lVar25 + lVar28));
        fVar94 = expf(-*(float *)((long)pvVar22 + lVar25 + lVar28 * 2));
        fVar98 = tanhf(fVar98);
        fVar98 = *(float *)((long)pvVar6 + lVar25) / (fVar93 + 1.0) + fVar98 / (fVar81 + 1.0);
        fVar81 = tanhf(fVar98);
        fVar81 = fVar81 / (fVar94 + 1.0);
        in_ZMM1 = ZEXT464((uint)fVar98);
        *(float *)((long)pvVar6 + lVar25) = fVar98;
        *(float *)((long)pvVar63 + lVar25) = fVar81;
        *(float *)((long)pvVar5 + lVar25 + lVar29) = fVar81;
        lVar25 = lVar25 + 4;
      }
    }
  }
  Mat::~Mat(&gates);
  return local_1a8;
}

Assistant:

static int lstm(const Mat& bottom_blob, Mat& top_blob, int reverse, const Mat& weight_xc, const Mat& bias_c, const Mat& weight_hc, Mat& hidden_state, Mat& cell_state, const Option& opt)
{
    int size = bottom_blob.w;
    int T = bottom_blob.h;

    int num_output = top_blob.w;

    // 4 x num_output
    Mat gates(4, num_output, 4u, opt.workspace_allocator);
    if (gates.empty())
        return -100;

    // unroll
    for (int t = 0; t < T; t++)
    {
        // clip hidden by continuation indicator
        // h_cont_{t-1} = cont_t * h_{t-1}
        // h_cont_{t-1} = h_{t-1} if cont_t == 1
        //                0       otherwise
        // calculate hidden
        // gate_input_t := W_hc * h_conted_{t-1} + W_xc * x_t + b_c

        int ti = reverse ? T - 1 - t : t;

        const float* x = bottom_blob.row(ti);
        for (int q = 0; q < num_output; q++)
        {
            const float* bias_c_I = bias_c.row(0);
            const float* bias_c_F = bias_c.row(1);
            const float* bias_c_O = bias_c.row(2);
            const float* bias_c_G = bias_c.row(3);

            float* gates_data = gates.row(q);

            // gate I F O G
            const float* weight_xc_I = weight_xc.row(num_output * 0 + q);
            const float* weight_xc_F = weight_xc.row(num_output * 1 + q);
            const float* weight_xc_O = weight_xc.row(num_output * 2 + q);
            const float* weight_xc_G = weight_xc.row(num_output * 3 + q);

            const float* weight_hc_I = weight_hc.row(num_output * 0 + q);
            const float* weight_hc_F = weight_hc.row(num_output * 1 + q);
            const float* weight_hc_O = weight_hc.row(num_output * 2 + q);
            const float* weight_hc_G = weight_hc.row(num_output * 3 + q);

            float I = bias_c_I[q];
            float F = bias_c_F[q];
            float O = bias_c_O[q];
            float G = bias_c_G[q];

            for (int i = 0; i < size; i++)
            {
                float xi = x[i];

                I += weight_xc_I[i] * xi;
                F += weight_xc_F[i] * xi;
                O += weight_xc_O[i] * xi;
                G += weight_xc_G[i] * xi;
            }

            for (int i = 0; i < num_output; i++)
            {
                float h_cont = hidden_state[i];

                I += weight_hc_I[i] * h_cont;
                F += weight_hc_F[i] * h_cont;
                O += weight_hc_O[i] * h_cont;
                G += weight_hc_G[i] * h_cont;
            }

            gates_data[0] = I;
            gates_data[1] = F;
            gates_data[2] = O;
            gates_data[3] = G;
        }

        // lstm unit
        // sigmoid(I)
        // sigmoid(F)
        // sigmoid(O)
        // tanh(G)
        // c_t := f_t .* c_{t-1} + i_t .* g_t
        // h_t := o_t .* tanh[c_t]
        float* output_data = top_blob.row(ti);
        for (int q = 0; q < num_output; q++)
        {
            const float* gates_data = gates.row(q);

            float I = gates_data[0];
            float F = gates_data[1];
            float O = gates_data[2];
            float G = gates_data[3];

            I = 1.f / (1.f + exp(-I));
            F = 1.f / (1.f + exp(-F));
            O = 1.f / (1.f + exp(-O));
            G = tanh(G);

            float cell2 = F * cell_state[q] + I * G;
            float H = O * tanh(cell2);
            cell_state[q] = cell2;
            hidden_state[q] = H;
            output_data[q] = H;
        }
    }

    return 0;
}